

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

bool embree::sse2::InstanceArrayIntersector1MB::pointQuery
               (PointQuery *query,PointQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float (*pafVar2) [16];
  float *pfVar3;
  float *pfVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  Geometry *pGVar8;
  long *plVar9;
  long lVar10;
  RTCPointQueryContext *pRVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  undefined1 uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  _func_int *p_Var21;
  undefined1 auVar25 [12];
  float fVar22;
  float fVar23;
  float fVar24;
  float extraout_XMM0_Db;
  undefined1 in_XMM0 [16];
  undefined1 extraout_var [12];
  float extraout_XMM0_Dc;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  float fVar29;
  undefined1 in_XMM1 [16];
  vfloat4 a0;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float in_XMM2_Da;
  float in_XMM2_Db;
  float fVar39;
  float in_XMM2_Dc;
  float fVar41;
  float in_XMM2_Dd;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar40;
  undefined1 auVar38 [16];
  float in_XMM3_Da;
  undefined1 auVar42 [12];
  float in_XMM3_Db;
  float in_XMM3_Dc;
  float in_XMM3_Dd;
  vfloat4 l02;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float in_XMM4_Da;
  float fVar45;
  float in_XMM4_Db;
  float fVar46;
  float in_XMM4_Dc;
  float fVar47;
  float in_XMM4_Dd;
  float fVar48;
  undefined1 auVar49 [12];
  float fVar51;
  undefined1 in_XMM5 [16];
  float fVar52;
  float fVar53;
  undefined1 auVar50 [16];
  float in_XMM6_Da;
  float fVar54;
  float in_XMM6_Db;
  float in_XMM6_Dc;
  float fVar55;
  float in_XMM6_Dd;
  undefined1 auVar58 [12];
  float fVar56;
  float fVar57;
  float fVar61;
  uint uVar62;
  undefined1 in_XMM7 [16];
  undefined1 auVar59 [16];
  float fVar63;
  undefined1 auVar60 [16];
  float fVar64;
  float fVar68;
  float fVar69;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float in_XMM10_Da;
  float in_XMM10_Db;
  float in_XMM10_Dc;
  float in_XMM10_Dd;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float in_XMM11_Da;
  float fVar82;
  float in_XMM11_Db;
  float fVar83;
  float in_XMM11_Dc;
  float fVar84;
  float in_XMM11_Dd;
  float in_XMM12_Da;
  float fVar85;
  float in_XMM12_Db;
  float in_XMM12_Dc;
  float in_XMM12_Dd;
  vfloat4 a0_1;
  undefined1 auVar86 [16];
  float in_XMM13_Da;
  float in_XMM13_Db;
  float in_XMM13_Dc;
  float in_XMM13_Dd;
  undefined1 in_XMM14 [16];
  undefined1 auVar87 [16];
  float in_XMM15_Da;
  float in_XMM15_Db;
  float in_XMM15_Dc;
  float in_XMM15_Dd;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  float local_138;
  float fStack_134;
  float fStack_130;
  float local_108;
  float fStack_104;
  float fStack_100;
  undefined8 local_d8;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  _func_int *local_98;
  undefined8 local_90;
  PointQuery *local_88;
  undefined4 local_80;
  PointQueryFunction local_78;
  RTCPointQueryContext *local_70;
  float local_68;
  void *local_60;
  undefined8 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  auVar58 = in_XMM7._0_12_;
  a0.field_0._0_12_ = in_XMM1._0_12_;
  auVar49 = in_XMM5._0_12_;
  auVar25 = in_XMM0._0_12_;
  uVar19 = (ulong)prim->primID_;
  pGVar8 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var21 = *(_func_int **)&pGVar8->field_0x58;
  if ((p_Var21 == (_func_int *)0x0) &&
     ((uVar17 = (ulong)*(uint *)(*(long *)&pGVar8[1].time_range.upper +
                                (long)pGVar8[1].intersectionFilterN * uVar19), uVar17 == 0xffffffff
      || (p_Var21 = pGVar8[1].super_RefCount._vptr_RefCount[uVar17], p_Var21 == (_func_int *)0x0))))
  {
    return false;
  }
  if (pGVar8->numTimeSteps == 1) {
    plVar9 = *(long **)&pGVar8[1].fnumTimeSegments;
    iVar7 = (int)plVar9[4];
    if ((pGVar8->field_8).field_0x1 == '\x01') {
      fVar63 = in_XMM3_Db;
      fVar61 = in_XMM3_Dc;
      if (iVar7 < 0x9244) {
        if (iVar7 == 0x9134) {
          lVar10 = *plVar9;
          lVar20 = uVar19 * plVar9[2];
          in_XMM13_Db = *(float *)(lVar10 + 0x10 + lVar20);
          in_XMM13_Da = *(float *)(lVar10 + lVar20);
          in_XMM3_Da = *(float *)(lVar10 + 8 + lVar20);
          in_XMM2_Da = *(float *)(lVar10 + 0xc + lVar20);
          in_XMM13_Dc = *(float *)(lVar10 + 0x20 + lVar20);
          in_XMM13_Dd = 0.0;
          in_XMM0._4_4_ = *(undefined4 *)(lVar10 + 0x14 + lVar20);
          in_XMM0._0_4_ = *(undefined4 *)(lVar10 + 4 + lVar20);
          in_XMM0._8_4_ = *(undefined4 *)(lVar10 + 0x24 + lVar20);
          in_XMM0._12_4_ = 0;
          in_XMM3_Dd = 0.0;
          in_XMM2_Db = *(float *)(lVar10 + 0x1c + lVar20);
          in_XMM2_Dc = *(float *)(lVar10 + 0x2c + lVar20);
          in_XMM2_Dd = 0.0;
          fVar63 = *(float *)(lVar10 + 0x18 + lVar20);
          fVar61 = *(float *)(lVar10 + 0x28 + lVar20);
        }
        else if (iVar7 == 0x9234) {
          lVar10 = *plVar9;
          lVar20 = uVar19 * plVar9[2];
          uVar5 = *(undefined8 *)(lVar10 + 4 + lVar20);
          in_XMM13_Da = *(float *)(lVar10 + lVar20);
          in_XMM13_Db = (float)uVar5;
          in_XMM13_Dc = (float)((ulong)uVar5 >> 0x20);
          in_XMM13_Dd = 0.0;
          uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar20);
          in_XMM0._4_4_ = (int)uVar5;
          in_XMM0._0_4_ = *(undefined4 *)(lVar10 + 0xc + lVar20);
          in_XMM0._8_4_ = (int)((ulong)uVar5 >> 0x20);
          in_XMM0._12_4_ = 0;
          uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar20);
          in_XMM3_Da = *(float *)(lVar10 + 0x18 + lVar20);
          in_XMM3_Dd = 0.0;
          uVar6 = *(undefined8 *)(lVar10 + 0x28 + lVar20);
          in_XMM2_Da = *(float *)(lVar10 + 0x24 + lVar20);
          in_XMM2_Db = (float)uVar6;
          in_XMM2_Dc = (float)((ulong)uVar6 >> 0x20);
          in_XMM2_Dd = 0.0;
          fVar63 = (float)uVar5;
          fVar61 = (float)((ulong)uVar5 >> 0x20);
        }
      }
      else if (iVar7 == 0xb001) {
        lVar10 = *plVar9;
        lVar20 = uVar19 * plVar9[2];
        pfVar1 = (float *)(lVar10 + 0x10 + lVar20);
        in_XMM3_Da = *pfVar1;
        fVar63 = pfVar1[1];
        uVar5 = *(undefined8 *)(lVar10 + 0x34 + lVar20);
        in_XMM13_Da = *(float *)(lVar10 + lVar20);
        fVar61 = *(float *)(lVar10 + 8 + lVar20);
        in_XMM0._4_4_ = *(undefined4 *)(lVar10 + 4 + lVar20);
        in_XMM0._0_4_ = *(undefined4 *)(lVar10 + 0xc + lVar20);
        in_XMM13_Db = (float)uVar5;
        in_XMM13_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM2_Da = *(float *)(lVar10 + 0x18 + lVar20);
        uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar20);
        fVar57 = *(float *)(lVar10 + 0x24 + lVar20);
        fVar82 = *(float *)(lVar10 + 0x28 + lVar20);
        fVar83 = *(float *)(lVar10 + 0x2c + lVar20);
        fVar84 = *(float *)(lVar10 + 0x30 + lVar20);
        fVar41 = fVar84 * fVar84 + fVar83 * fVar83 + fVar57 * fVar57 + fVar82 * fVar82;
        auVar27 = rsqrtss(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
        fVar39 = auVar27._0_4_;
        fVar39 = fVar39 * fVar39 * fVar41 * -0.5 * fVar39 + fVar39 * 1.5;
        in_XMM2_Dd = fVar57 * fVar39;
        in_XMM13_Dd = fVar82 * fVar39;
        in_XMM3_Dd = fVar39 * fVar84;
        in_XMM0._12_4_ = fVar83 * fVar39;
        in_XMM0._8_4_ = *(undefined4 *)(lVar10 + 0x3c + lVar20);
        in_XMM2_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM2_Db = (float)uVar5;
      }
      else if (iVar7 == 0x9244) {
        lVar10 = *plVar9;
        lVar20 = uVar19 * plVar9[2];
        pfVar1 = (float *)(lVar10 + lVar20);
        in_XMM13_Da = *pfVar1;
        in_XMM13_Db = pfVar1[1];
        in_XMM13_Dc = pfVar1[2];
        in_XMM13_Dd = pfVar1[3];
        in_XMM0 = *(undefined1 (*) [16])(lVar10 + 0x10 + lVar20);
        pfVar1 = (float *)(lVar10 + 0x20 + lVar20);
        in_XMM3_Da = *pfVar1;
        fVar63 = pfVar1[1];
        fVar61 = pfVar1[2];
        in_XMM3_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar10 + 0x30 + lVar20);
        in_XMM2_Da = *pfVar1;
        in_XMM2_Db = pfVar1[1];
        in_XMM2_Dc = pfVar1[2];
        in_XMM2_Dd = pfVar1[3];
      }
      fVar82 = in_XMM0._4_4_;
      fVar57 = in_XMM0._12_4_;
      fVar40 = in_XMM13_Dd * fVar57 + in_XMM3_Dd * in_XMM2_Dd;
      fVar83 = in_XMM13_Dd * fVar57 - in_XMM3_Dd * in_XMM2_Dd;
      fVar47 = in_XMM2_Dd * in_XMM2_Dd - in_XMM13_Dd * in_XMM13_Dd;
      fVar84 = in_XMM2_Dd * in_XMM2_Dd + in_XMM13_Dd * in_XMM13_Dd + -fVar57 * fVar57 +
               -in_XMM3_Dd * in_XMM3_Dd;
      fVar41 = fVar57 * fVar57 + fVar47 + -in_XMM3_Dd * in_XMM3_Dd;
      fVar51 = in_XMM13_Dd * in_XMM3_Dd - fVar57 * in_XMM2_Dd;
      fVar39 = fVar57 * in_XMM2_Dd + in_XMM13_Dd * in_XMM3_Dd;
      fVar46 = fVar57 * in_XMM3_Dd + in_XMM13_Dd * in_XMM2_Dd;
      fVar45 = fVar57 * in_XMM3_Dd - in_XMM13_Dd * in_XMM2_Dd;
      fVar40 = fVar40 + fVar40;
      fVar51 = fVar51 + fVar51;
      fVar57 = in_XMM3_Dd * in_XMM3_Dd + fVar47 + -fVar57 * fVar57;
      in_XMM12_Da = fVar40 * 0.0 + fVar51 * 0.0;
      in_XMM12_Db = fVar40 * 1.0 + fVar51 * 0.0;
      in_XMM12_Dc = fVar40 * 0.0 + fVar51 * 1.0;
      in_XMM12_Dd = fVar40 * 0.0 + fVar51 * 0.0;
      in_XMM6_Da = fVar84 * 1.0 + in_XMM12_Da;
      in_XMM6_Db = fVar84 * 0.0 + in_XMM12_Db;
      in_XMM6_Dc = fVar84 * 0.0 + in_XMM12_Dc;
      in_XMM6_Dd = fVar84 * 0.0 + in_XMM12_Dd;
      fVar46 = fVar46 + fVar46;
      fVar83 = fVar83 + fVar83;
      auVar49._0_4_ = fVar83 * 1.0 + fVar41 * 0.0 + fVar46 * 0.0;
      auVar49._4_4_ = fVar83 * 0.0 + fVar41 * 1.0 + fVar46 * 0.0;
      auVar49._8_4_ = fVar83 * 0.0 + fVar41 * 0.0 + fVar46 * 1.0;
      fVar83 = fVar83 * 0.0 + fVar41 * 0.0 + fVar46 * 0.0;
      fVar39 = fVar39 + fVar39;
      fVar45 = fVar45 + fVar45;
      fVar84 = fVar39 * 1.0 + fVar45 * 0.0 + fVar57 * 0.0;
      fVar41 = fVar39 * 0.0 + fVar45 * 1.0 + fVar57 * 0.0;
      fVar40 = fVar39 * 0.0 + fVar45 * 0.0 + fVar57 * 1.0;
      fVar39 = fVar39 * 0.0 + fVar45 * 0.0 + fVar57 * 0.0;
      fVar45 = in_XMM13_Db + 0.0;
      fVar46 = in_XMM13_Dc + 0.0;
      fVar57 = fVar61 * fVar84;
      in_XMM3_Db = fVar61 * fVar41;
      in_XMM3_Dc = fVar61 * fVar40;
      in_XMM3_Dd = fVar61 * fVar39;
      auVar58._0_4_ = fVar84 * 0.0;
      auVar58._4_4_ = fVar41 * 0.0;
      auVar58._8_4_ = fVar40 * 0.0;
      in_XMM4_Da = auVar49._0_4_ * 0.0 + auVar58._0_4_;
      in_XMM4_Db = auVar49._4_4_ * 0.0 + auVar58._4_4_;
      in_XMM4_Dc = auVar49._8_4_ * 0.0 + auVar58._8_4_;
      in_XMM4_Dd = fVar83 * 0.0 + fVar39 * 0.0;
      in_XMM11_Da = in_XMM13_Da * in_XMM6_Da + in_XMM4_Da;
      in_XMM11_Db = in_XMM13_Da * in_XMM6_Db + in_XMM4_Db;
      in_XMM11_Dc = in_XMM13_Da * in_XMM6_Dc + in_XMM4_Dc;
      in_XMM11_Dd = in_XMM13_Da * in_XMM6_Dd + in_XMM4_Dd;
      auVar25._0_4_ = fVar82 * auVar49._0_4_ + auVar58._0_4_;
      auVar25._4_4_ = fVar82 * auVar49._4_4_ + auVar58._4_4_;
      auVar25._8_4_ = fVar82 * auVar49._8_4_ + auVar58._8_4_;
      fVar61 = in_XMM0._0_4_;
      in_XMM14._0_4_ = fVar61 * in_XMM6_Da + auVar25._0_4_;
      in_XMM14._4_4_ = fVar61 * in_XMM6_Db + auVar25._4_4_;
      in_XMM14._8_4_ = fVar61 * in_XMM6_Dc + auVar25._8_4_;
      in_XMM14._12_4_ = fVar61 * in_XMM6_Dd + fVar82 * fVar83 + fVar39 * 0.0;
      in_XMM13_Da = in_XMM3_Da * in_XMM6_Da + fVar63 * auVar49._0_4_ + fVar57;
      in_XMM13_Db = in_XMM3_Da * in_XMM6_Db + fVar63 * auVar49._4_4_ + in_XMM3_Db;
      in_XMM13_Dc = in_XMM3_Da * in_XMM6_Dc + fVar63 * auVar49._8_4_ + in_XMM3_Dc;
      in_XMM13_Dd = in_XMM3_Da * in_XMM6_Dd + fVar63 * fVar83 + in_XMM3_Dd;
      a0.field_0._0_4_ = in_XMM2_Db * auVar49._0_4_ + in_XMM2_Dc * fVar84;
      a0.field_0._4_4_ = in_XMM2_Db * auVar49._4_4_ + in_XMM2_Dc * fVar41;
      a0.field_0._8_4_ = in_XMM2_Db * auVar49._8_4_ + in_XMM2_Dc * fVar40;
      in_XMM15_Da = in_XMM2_Da * in_XMM6_Da + a0.field_0._0_4_ + fVar45;
      in_XMM15_Db = in_XMM2_Da * in_XMM6_Db + a0.field_0._4_4_ + fVar46;
      in_XMM15_Dc = in_XMM2_Da * in_XMM6_Dc + a0.field_0._8_4_ + in_XMM0._8_4_ + 0.0;
      in_XMM15_Dd = in_XMM2_Da * in_XMM6_Dd + in_XMM2_Db * fVar83 + in_XMM2_Dc * fVar39 + 0.0;
    }
    else {
      fVar57 = in_XMM3_Da;
      if (iVar7 < 0x9244) {
        if (iVar7 == 0x9134) {
          lVar10 = *plVar9;
          lVar20 = uVar19 * plVar9[2];
          in_XMM11_Db = *(float *)(lVar10 + 0x10 + lVar20);
          in_XMM11_Da = *(float *)(lVar10 + lVar20);
          in_XMM13_Da = *(float *)(lVar10 + 8 + lVar20);
          in_XMM15_Da = *(float *)(lVar10 + 0xc + lVar20);
          in_XMM11_Dc = *(float *)(lVar10 + 0x20 + lVar20);
          in_XMM11_Dd = 0.0;
          in_XMM14._4_4_ = (float)*(undefined4 *)(lVar10 + 0x14 + lVar20);
          in_XMM14._0_4_ = (float)*(undefined4 *)(lVar10 + 4 + lVar20);
          in_XMM14._8_4_ = (float)*(undefined4 *)(lVar10 + 0x24 + lVar20);
          in_XMM14._12_4_ = 0.0;
          in_XMM13_Db = *(float *)(lVar10 + 0x18 + lVar20);
          in_XMM13_Dc = *(float *)(lVar10 + 0x28 + lVar20);
          in_XMM13_Dd = 0.0;
          in_XMM15_Db = *(float *)(lVar10 + 0x1c + lVar20);
          in_XMM15_Dc = *(float *)(lVar10 + 0x2c + lVar20);
          auVar25._4_8_ = 0;
          auVar25._0_4_ = in_XMM15_Dc;
          in_XMM15_Dd = 0.0;
        }
        else if (iVar7 == 0x9234) {
          lVar10 = *plVar9;
          lVar20 = uVar19 * plVar9[2];
          uVar5 = *(undefined8 *)(lVar10 + 4 + lVar20);
          in_XMM11_Da = *(float *)(lVar10 + lVar20);
          in_XMM11_Db = (float)uVar5;
          in_XMM11_Dc = (float)((ulong)uVar5 >> 0x20);
          in_XMM11_Dd = 0.0;
          uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar20);
          in_XMM14._4_4_ = (float)(int)uVar5;
          in_XMM14._0_4_ = (float)*(undefined4 *)(lVar10 + 0xc + lVar20);
          in_XMM14._8_4_ = (float)(int)((ulong)uVar5 >> 0x20);
          in_XMM14._12_4_ = 0.0;
          uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar20);
          in_XMM13_Da = *(float *)(lVar10 + 0x18 + lVar20);
          in_XMM13_Db = (float)uVar5;
          in_XMM13_Dc = (float)((ulong)uVar5 >> 0x20);
          in_XMM13_Dd = 0.0;
          uVar19 = *(ulong *)(lVar10 + 0x28 + lVar20);
          auVar25._8_4_ = 0.0;
          auVar25._0_8_ = uVar19;
          in_XMM15_Da = *(float *)(lVar10 + 0x24 + lVar20);
          in_XMM15_Db = (float)uVar19;
          in_XMM15_Dc = (float)(uVar19 >> 0x20);
          in_XMM15_Dd = 0.0;
        }
      }
      else if (iVar7 == 0xb001) {
        lVar10 = *plVar9;
        lVar20 = uVar19 * plVar9[2];
        uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar20);
        in_XMM13_Da = (float)uVar5;
        in_XMM13_Db = (float)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar10 + 0x34 + lVar20);
        in_XMM11_Da = *(float *)(lVar10 + lVar20);
        in_XMM13_Dc = *(float *)(lVar10 + 8 + lVar20);
        in_XMM3_Db = 0.0;
        in_XMM3_Dc = 0.0;
        in_XMM3_Dd = 0.0;
        in_XMM14._4_4_ = (float)*(undefined4 *)(lVar10 + 4 + lVar20);
        in_XMM14._0_4_ = (float)*(undefined4 *)(lVar10 + 0xc + lVar20);
        in_XMM11_Db = (float)uVar5;
        in_XMM11_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM15_Da = *(float *)(lVar10 + 0x18 + lVar20);
        uVar19 = *(ulong *)(lVar10 + 0x1c + lVar20);
        a0.field_0._8_4_ = 0.0;
        a0.field_0._0_8_ = uVar19;
        in_XMM15_Db = (float)uVar19;
        in_XMM15_Dc = (float)(uVar19 >> 0x20);
        fVar57 = *(float *)(lVar10 + 0x24 + lVar20);
        fVar61 = *(float *)(lVar10 + 0x28 + lVar20);
        fVar63 = *(float *)(lVar10 + 0x2c + lVar20);
        in_XMM6_Da = *(float *)(lVar10 + 0x30 + lVar20);
        in_XMM6_Db = 0.0;
        in_XMM6_Dc = 0.0;
        in_XMM6_Dd = 0.0;
        fVar83 = in_XMM6_Da * in_XMM6_Da + fVar63 * fVar63 + fVar57 * fVar57 + fVar61 * fVar61;
        auVar27 = rsqrtss(ZEXT416((uint)fVar83),ZEXT416((uint)fVar83));
        fVar82 = auVar27._0_4_;
        auVar59._4_12_ = auVar27._4_12_;
        fVar82 = fVar82 * fVar82 * fVar83 * -0.5 * fVar82 + fVar82 * 1.5;
        in_XMM15_Dd = fVar57 * fVar82;
        auVar49._0_4_ = fVar61 * fVar82;
        in_XMM4_Da = fVar63 * fVar82;
        in_XMM4_Db = 0.0;
        in_XMM4_Dc = 0.0;
        in_XMM4_Dd = 0.0;
        auVar59._0_4_ = fVar82 * in_XMM6_Da;
        auVar58._8_4_ = in_XMM13_Dc;
        auVar58._0_8_ = auVar59._0_8_;
        auVar49._4_4_ = 0.0;
        auVar49._8_4_ = in_XMM11_Dc;
        auVar25._0_8_ = CONCAT44(in_XMM4_Da,*(undefined4 *)(lVar10 + 0x3c + lVar20));
        auVar25._8_4_ = 0.0;
        in_XMM14._8_8_ = auVar25._0_8_;
        in_XMM11_Dd = auVar49._0_4_;
        in_XMM13_Dd = auVar59._0_4_;
        fVar57 = in_XMM13_Dc;
      }
      else if (iVar7 == 0x9244) {
        lVar10 = *plVar9;
        lVar20 = uVar19 * plVar9[2];
        pfVar1 = (float *)(lVar10 + lVar20);
        in_XMM11_Da = *pfVar1;
        in_XMM11_Db = pfVar1[1];
        in_XMM11_Dc = pfVar1[2];
        in_XMM11_Dd = pfVar1[3];
        in_XMM14 = *(undefined1 (*) [16])(lVar10 + 0x10 + lVar20);
        pfVar1 = (float *)(lVar10 + 0x20 + lVar20);
        in_XMM13_Da = *pfVar1;
        in_XMM13_Db = pfVar1[1];
        in_XMM13_Dc = pfVar1[2];
        in_XMM13_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar10 + 0x30 + lVar20);
        in_XMM15_Da = *pfVar1;
        in_XMM15_Db = pfVar1[1];
        in_XMM15_Dc = pfVar1[2];
        in_XMM15_Dd = pfVar1[3];
      }
    }
  }
  else {
    fVar57 = pGVar8->fnumTimeSegments;
    fVar63 = 0.0;
    fVar39 = 0.0;
    fVar82 = 0.0;
    fVar61 = (pGVar8->time_range).lower;
    auVar27 = ZEXT416((uint)fVar61);
    fVar45 = ((query->time - fVar61) / ((pGVar8->time_range).upper - fVar61)) * fVar57;
    fVar84 = fVar57;
    fVar40 = floorf(fVar45);
    fStack_214 = 0.0;
    fVar61 = 0.0;
    fStack_210 = 0.0;
    fVar83 = 0.0;
    fStack_20c = 0.0;
    fVar41 = 0.0;
    if (fVar57 + -1.0 <= fVar40) {
      fVar40 = fVar57 + -1.0;
    }
    auVar37._4_12_ = extraout_var;
    auVar37._0_4_ = fVar40;
    auVar30 = ZEXT812(0);
    if (0.0 <= fVar40) {
      auVar30._4_8_ = 0;
      auVar30._0_4_ = fVar40;
    }
    auVar44._12_4_ = 0;
    auVar44._0_12_ = auVar30;
    uVar16 = (uint)auVar30._0_4_;
    fVar45 = fVar45 - auVar30._0_4_;
    lVar10 = *(long *)&pGVar8[1].fnumTimeSegments;
    plVar9 = (long *)(lVar10 + (ulong)uVar16 * 0x38);
    iVar7 = *(int *)(lVar10 + 0x20 + (ulong)uVar16 * 0x38);
    if ((pGVar8->field_8).field_0x1 == '\x01') {
      fVar57 = fVar45;
      if (iVar7 < 0x9244) {
        if (iVar7 == 0x9134) {
          lVar20 = *plVar9;
          lVar18 = plVar9[2] * uVar19;
          in_XMM10_Db = *(float *)(lVar20 + 0x10 + lVar18);
          in_XMM10_Da = *(float *)(lVar20 + lVar18);
          in_XMM11_Da = *(float *)(lVar20 + 4 + lVar18);
          fVar57 = *(float *)(lVar20 + 8 + lVar18);
          in_XMM10_Dc = *(float *)(lVar20 + 0x20 + lVar18);
          in_XMM11_Db = *(float *)(lVar20 + 0x14 + lVar18);
          in_XMM11_Dc = *(float *)(lVar20 + 0x24 + lVar18);
          fVar61 = *(float *)(lVar20 + 0x18 + lVar18);
          fVar83 = *(float *)(lVar20 + 0x28 + lVar18);
          auVar32._4_4_ = *(undefined4 *)(lVar20 + 0x1c + lVar18);
          auVar32._0_4_ = *(undefined4 *)(lVar20 + 0xc + lVar18);
          auVar32._8_4_ = *(undefined4 *)(lVar20 + 0x2c + lVar18);
        }
        else {
          fVar61 = fStack_214;
          fVar83 = fStack_210;
          fVar41 = fStack_20c;
          if (iVar7 != 0x9234) goto LAB_00a073e5;
          lVar20 = *plVar9;
          lVar18 = plVar9[2] * uVar19;
          uVar5 = *(undefined8 *)(lVar20 + 4 + lVar18);
          in_XMM10_Da = *(float *)(lVar20 + lVar18);
          in_XMM10_Db = (float)uVar5;
          in_XMM10_Dc = (float)((ulong)uVar5 >> 0x20);
          uVar5 = *(undefined8 *)(lVar20 + 0x10 + lVar18);
          in_XMM11_Da = *(float *)(lVar20 + 0xc + lVar18);
          in_XMM11_Db = (float)uVar5;
          in_XMM11_Dc = (float)((ulong)uVar5 >> 0x20);
          uVar5 = *(undefined8 *)(lVar20 + 0x1c + lVar18);
          fVar57 = *(float *)(lVar20 + 0x18 + lVar18);
          fVar61 = (float)uVar5;
          fVar83 = (float)((ulong)uVar5 >> 0x20);
          uVar5 = *(undefined8 *)(lVar20 + 0x28 + lVar18);
          auVar32._4_4_ = (int)uVar5;
          auVar32._0_4_ = *(undefined4 *)(lVar20 + 0x24 + lVar18);
          auVar32._8_4_ = (int)((ulong)uVar5 >> 0x20);
        }
        fVar41 = 0.0;
        in_XMM10_Dd = 0.0;
        fStack_1fc = 0.0;
        _local_208 = auVar32;
        in_XMM11_Dd = 0.0;
      }
      else if (iVar7 == 0xb001) {
        lVar20 = *plVar9;
        lVar18 = plVar9[2] * uVar19;
        pfVar1 = (float *)(lVar20 + 0x10 + lVar18);
        fVar57 = *pfVar1;
        fVar61 = pfVar1[1];
        uVar5 = *(undefined8 *)(lVar20 + 0x34 + lVar18);
        in_XMM10_Da = *(float *)(lVar20 + lVar18);
        in_XMM11_Db = *(float *)(lVar20 + 4 + lVar18);
        fVar83 = *(float *)(lVar20 + 8 + lVar18);
        in_XMM11_Da = *(float *)(lVar20 + 0xc + lVar18);
        in_XMM13_Da = *(float *)(lVar20 + 0x18 + lVar18);
        uVar6 = *(undefined8 *)(lVar20 + 0x1c + lVar18);
        in_XMM13_Db = (float)uVar6;
        in_XMM13_Dc = (float)((ulong)uVar6 >> 0x20);
        fVar63 = *(float *)(lVar20 + 0x24 + lVar18);
        in_XMM10_Dd = *(float *)(lVar20 + 0x28 + lVar18);
        fVar82 = *(float *)(lVar20 + 0x2c + lVar18);
        fVar84 = *(float *)(lVar20 + 0x30 + lVar18);
        fVar41 = fVar84 * fVar84 + fVar82 * fVar82 + fVar63 * fVar63 + in_XMM10_Dd * in_XMM10_Dd;
        auVar27 = rsqrtss(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
        fVar39 = auVar27._0_4_;
        fVar41 = fVar39 * fVar39 * fVar41 * -0.5 * fVar39 + fVar39 * 1.5;
        in_XMM13_Dd = fVar63 * fVar41;
        in_XMM10_Dd = in_XMM10_Dd * fVar41;
        in_XMM11_Dd = fVar82 * fVar41;
        fVar41 = fVar41 * fVar84;
        in_XMM10_Db = (float)uVar5;
        in_XMM10_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM11_Dc = *(float *)(lVar20 + 0x3c + lVar18);
        fVar63 = 0.0;
        fVar82 = 0.0;
        local_208._4_4_ = in_XMM13_Db;
        local_208._0_4_ = in_XMM13_Da;
        fStack_200 = in_XMM13_Dc;
        fStack_1fc = in_XMM13_Dd;
        fVar84 = in_XMM13_Dd;
        fVar39 = in_XMM13_Dc;
      }
      else if (iVar7 == 0x9244) {
        lVar20 = *plVar9;
        lVar18 = plVar9[2] * uVar19;
        pfVar1 = (float *)(lVar20 + lVar18);
        in_XMM10_Da = *pfVar1;
        in_XMM10_Db = pfVar1[1];
        in_XMM10_Dc = pfVar1[2];
        in_XMM10_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar20 + 0x10 + lVar18);
        in_XMM11_Da = *pfVar1;
        in_XMM11_Db = pfVar1[1];
        in_XMM11_Dc = pfVar1[2];
        in_XMM11_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar20 + 0x20 + lVar18);
        fVar57 = *pfVar1;
        fVar61 = pfVar1[1];
        fVar83 = pfVar1[2];
        fVar41 = pfVar1[3];
        _local_208 = *(undefined1 (*) [16])(lVar20 + 0x30 + lVar18);
      }
LAB_00a073e5:
      lVar20 = (ulong)(uVar16 + 1) * 0x38;
      plVar9 = (long *)(lVar10 + lVar20);
      iVar7 = *(int *)(lVar10 + 0x20 + lVar20);
      if (iVar7 < 0x9244) {
        if (iVar7 == 0x9134) {
          lVar10 = *plVar9;
          lVar20 = uVar19 * plVar9[2];
          in_XMM13_Db = *(float *)(lVar10 + 0x10 + lVar20);
          in_XMM13_Da = *(float *)(lVar10 + lVar20);
          in_XMM15_Da = *(float *)(lVar10 + 4 + lVar20);
          fVar84 = *(float *)(lVar10 + 0xc + lVar20);
          in_XMM13_Dc = *(float *)(lVar10 + 0x20 + lVar20);
          in_XMM13_Dd = 0.0;
          in_XMM15_Db = *(float *)(lVar10 + 0x14 + lVar20);
          in_XMM15_Dc = *(float *)(lVar10 + 0x24 + lVar20);
          in_XMM15_Dd = 0.0;
          in_XMM14._4_4_ = (float)*(undefined4 *)(lVar10 + 0x18 + lVar20);
          in_XMM14._0_4_ = (float)*(undefined4 *)(lVar10 + 8 + lVar20);
          in_XMM14._8_4_ = (float)*(undefined4 *)(lVar10 + 0x28 + lVar20);
          in_XMM14._12_4_ = 0.0;
          fVar63 = *(float *)(lVar10 + 0x1c + lVar20);
          fVar39 = *(float *)(lVar10 + 0x2c + lVar20);
          fVar82 = 0.0;
        }
        else if (iVar7 == 0x9234) {
          lVar10 = *plVar9;
          lVar20 = uVar19 * plVar9[2];
          uVar5 = *(undefined8 *)(lVar10 + 4 + lVar20);
          in_XMM13_Da = *(float *)(lVar10 + lVar20);
          in_XMM13_Db = (float)uVar5;
          in_XMM13_Dc = (float)((ulong)uVar5 >> 0x20);
          in_XMM13_Dd = 0.0;
          uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar20);
          in_XMM15_Da = *(float *)(lVar10 + 0xc + lVar20);
          in_XMM15_Db = (float)uVar5;
          in_XMM15_Dc = (float)((ulong)uVar5 >> 0x20);
          in_XMM15_Dd = 0.0;
          uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar20);
          in_XMM14._4_4_ = (float)(int)uVar5;
          in_XMM14._0_4_ = (float)*(undefined4 *)(lVar10 + 0x18 + lVar20);
          in_XMM14._8_4_ = (float)(int)((ulong)uVar5 >> 0x20);
          in_XMM14._12_4_ = 0.0;
          uVar5 = *(undefined8 *)(lVar10 + 0x28 + lVar20);
          fVar84 = *(float *)(lVar10 + 0x24 + lVar20);
          fVar63 = (float)uVar5;
          fVar39 = (float)((ulong)uVar5 >> 0x20);
          fVar82 = 0.0;
        }
      }
      else if (iVar7 == 0xb001) {
        lVar10 = *plVar9;
        lVar20 = uVar19 * plVar9[2];
        uVar5 = *(undefined8 *)(lVar10 + 0x34 + lVar20);
        in_XMM13_Da = *(float *)(lVar10 + lVar20);
        in_XMM15_Db = *(float *)(lVar10 + 4 + lVar20);
        in_XMM15_Da = *(float *)(lVar10 + 0xc + lVar20);
        in_XMM13_Db = (float)uVar5;
        in_XMM13_Dc = (float)((ulong)uVar5 >> 0x20);
        fVar84 = *(float *)(lVar10 + 0x18 + lVar20);
        uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar20);
        fVar82 = *(float *)(lVar10 + 0x24 + lVar20);
        fVar63 = *(float *)(lVar10 + 0x28 + lVar20);
        fVar39 = *(float *)(lVar10 + 0x2c + lVar20);
        fVar40 = *(float *)(lVar10 + 0x30 + lVar20);
        fVar47 = fVar40 * fVar40 + fVar39 * fVar39 + fVar82 * fVar82 + fVar63 * fVar63;
        auVar27 = rsqrtss(ZEXT416((uint)fVar47),ZEXT416((uint)fVar47));
        fVar46 = auVar27._0_4_;
        fVar46 = fVar46 * fVar46 * fVar47 * -0.5 * fVar46 + fVar46 * 1.5;
        fVar82 = fVar82 * fVar46;
        in_XMM13_Dd = fVar63 * fVar46;
        in_XMM15_Dd = fVar39 * fVar46;
        in_XMM14._8_4_ = (float)*(undefined4 *)(lVar10 + 8 + lVar20);
        in_XMM14._0_8_ = *(undefined8 *)(lVar10 + 0x10 + lVar20);
        in_XMM14._12_4_ = fVar46 * fVar40;
        in_XMM15_Dc = *(float *)(lVar10 + 0x3c + lVar20);
        fVar39 = (float)((ulong)uVar5 >> 0x20);
        fVar63 = (float)uVar5;
      }
      else if (iVar7 == 0x9244) {
        lVar10 = *plVar9;
        lVar20 = uVar19 * plVar9[2];
        pfVar1 = (float *)(lVar10 + lVar20);
        in_XMM13_Da = *pfVar1;
        in_XMM13_Db = pfVar1[1];
        in_XMM13_Dc = pfVar1[2];
        in_XMM13_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar10 + 0x10 + lVar20);
        in_XMM15_Da = *pfVar1;
        in_XMM15_Db = pfVar1[1];
        in_XMM15_Dc = pfVar1[2];
        in_XMM15_Dd = pfVar1[3];
        in_XMM14 = *(undefined1 (*) [16])(lVar10 + 0x20 + lVar20);
        pfVar1 = (float *)(lVar10 + 0x30 + lVar20);
        fVar84 = *pfVar1;
        fVar63 = pfVar1[1];
        fVar39 = pfVar1[2];
        fVar82 = pfVar1[3];
      }
      fVar47 = in_XMM14._12_4_;
      fVar46 = fVar41 * fVar47 +
               in_XMM11_Dd * in_XMM15_Dd + fVar82 * fStack_1fc + in_XMM10_Dd * in_XMM13_Dd;
      fVar40 = -fVar46;
      fStack_1b0 = -fVar41;
      fStack_1ac = -fVar41;
      if (fVar46 < fVar40) {
        in_XMM15_Dd = -in_XMM15_Dd;
      }
      fVar52 = ABS(fVar46);
      fVar51 = fVar40;
      if (fVar40 <= fVar46) {
        fVar51 = fVar46;
      }
      fVar53 = 1.0 - fVar52;
      local_1b8 = (undefined1  [8])(CONCAT44(fVar41,fVar51) ^ 0x8000000000000000);
      auVar27 = _local_1b8;
      if (fVar53 < 0.0) {
        fVar53 = sqrtf(fVar53);
      }
      else {
        fVar53 = SQRT(fVar53);
      }
      fVar47 = (float)(~-(uint)(fVar46 < fVar40) & (uint)fVar47 |
                      (uint)-fVar47 & -(uint)(fVar46 < fVar40));
      fVar53 = 1.5707964 -
               fVar53 * (((((fVar52 * -0.0043095737 + 0.0192803) * fVar52 + -0.04489909) * fVar52 +
                          0.08785567) * fVar52 + -0.21450998) * fVar52 + 1.5707952);
      fVar40 = 0.0;
      if (0.0 <= fVar53) {
        fVar40 = fVar53;
      }
      fVar54 = (float)(-(uint)(1.0 < fVar52) & 0x7fc00000 |
                      ~-(uint)(1.0 < fVar52) &
                      (uint)(1.5707964 -
                            (float)((uint)-fVar40 & -(uint)(fVar51 < 0.0) |
                                   ~-(uint)(fVar51 < 0.0) & (uint)fVar40))) * fVar45;
      fVar53 = floorf(fVar54 * 0.63661975);
      fVar54 = fVar54 - fVar53 * 1.5707964;
      fVar52 = fVar54 * fVar54;
      uVar16 = (int)fVar53 & 3;
      fVar40 = ((((fVar52 * -2.5963018e-07 + 2.4756235e-05) * fVar52 + -0.001388833) * fVar52 +
                0.04166664) * fVar52 + -0.5) * fVar52 + 1.0;
      fVar54 = (((((fVar52 * -2.5029328e-08 + 2.7600126e-06) * fVar52 + -0.00019842605) * fVar52 +
                 0.008333348) * fVar52 + -0.16666667) * fVar52 + 1.0) * fVar54;
      fVar52 = fVar54;
      if (((int)fVar53 & 1U) != 0) {
        fVar52 = fVar40;
        fVar40 = fVar54;
      }
      if (uVar16 - 1 < 2) {
        fVar40 = -fVar40;
      }
      fVar54 = fVar51 * in_XMM11_Dd - in_XMM15_Dd;
      fVar53 = fVar51 * fVar41 - fVar47;
      if (uVar16 < 2) {
        fVar52 = -fVar52;
      }
      fVar56 = 1.0 - fVar45;
      fVar70 = fVar56 * in_XMM11_Dd + in_XMM15_Dd * fVar45;
      fVar47 = fVar56 * fVar41 + fVar47 * fVar45;
      uVar16 = (int)((uint)(fVar46 < 0.0) << 0x1f) >> 0x1f;
      uVar62 = (int)((uint)(fVar46 < 0.0) << 0x1f) >> 0x1f;
      fVar69 = (float)((uint)-fVar82 & uVar16 | ~uVar16 & (uint)fVar82);
      fVar73 = (float)((uint)-in_XMM13_Dd & uVar62 | ~uVar62 & (uint)in_XMM13_Dd);
      fVar82 = fVar51 * fStack_1fc - fVar69;
      fVar46 = fVar51 * in_XMM10_Dd - fVar73;
      auVar78._4_4_ = local_1b8._4_4_;
      auVar78._0_4_ = fVar53;
      auVar78._8_4_ = fStack_1b0;
      auVar78._12_4_ = fStack_1ac;
      auVar79._4_12_ = auVar78._4_12_;
      auVar79._0_4_ = fVar53 * fVar53 + fVar54 * fVar54 + fVar82 * fVar82 + fVar46 * fVar46;
      auVar66._4_4_ = local_1b8._4_4_;
      auVar66._0_4_ = auVar79._0_4_;
      auVar66._8_4_ = fStack_1b0;
      auVar66._12_4_ = fStack_1ac;
      auVar37 = rsqrtss(auVar66,auVar79);
      fVar68 = auVar37._0_4_;
      fVar71 = fVar68 * fVar68 * auVar79._0_4_ * -0.5 * fVar68 + fVar68 * 1.5;
      fVar68 = fStack_1fc * fVar56 + fVar69 * fVar45;
      fVar69 = in_XMM10_Dd * fVar56 + fVar73 * fVar45;
      fVar74 = fVar47 * fVar47 + fVar70 * fVar70 + fVar68 * fVar68 + fVar69 * fVar69;
      auVar37 = rsqrtss(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
      fVar73 = auVar37._0_4_;
      fVar73 = fVar73 * fVar73 * fVar74 * -0.5 * fVar73 + fVar73 * 1.5;
      uVar16 = (int)((uint)(0.9995 < fVar51) << 0x1f) >> 0x1f;
      uVar62 = (int)((uint)(0.9995 < fVar51) << 0x1f) >> 0x1f;
      fVar82 = (float)(~uVar16 & (uint)(fVar40 * fStack_1fc + fVar52 * fVar71 * fVar82) |
                      (uint)(fVar73 * fVar68) & uVar16);
      fVar46 = (float)(~uVar62 & (uint)(fVar40 * in_XMM10_Dd + fVar52 * fVar71 * fVar46) |
                      (uint)(fVar73 * fVar69) & uVar62);
      if (0.9995 < fVar51) {
        fVar70 = fVar70 * fVar73;
        fVar47 = fVar47 * fVar73;
      }
      else {
        fVar70 = in_XMM11_Dd * fVar40 + fVar54 * fVar71 * fVar52;
        fVar47 = fVar41 * fVar40 + fVar53 * fVar71 * fVar52;
      }
      fVar51 = in_XMM13_Db * fVar45;
      fVar53 = in_XMM13_Dc * fVar45;
      fVar41 = in_XMM10_Da * fVar56 + in_XMM13_Da * fVar45;
      fVar54 = in_XMM11_Dc * fVar56;
      fVar40 = in_XMM11_Da * fVar56 + in_XMM15_Da * fVar45;
      fVar52 = in_XMM11_Db * fVar56 + in_XMM15_Db * fVar45;
      local_138 = in_XMM14._0_4_;
      fStack_134 = in_XMM14._4_4_;
      fStack_130 = in_XMM14._8_4_;
      fVar68 = fVar57 * fVar56 + local_138 * fVar45;
      fVar61 = fVar61 * fVar56 + fStack_134 * fVar45;
      fVar83 = fVar83 * fVar56 + fStack_130 * fVar45;
      fVar84 = (float)local_208._0_4_ * fVar56 + fVar84 * fVar45;
      fVar69 = (float)local_208._4_4_ * fVar56 + fVar63 * fVar45;
      fVar71 = fStack_200 * fVar56 + fVar39 * fVar45;
      fVar74 = fVar46 * fVar70 + fVar82 * fVar47;
      fVar39 = fVar46 * fVar70 - fVar82 * fVar47;
      fVar63 = fVar82 * fVar82 + fVar46 * fVar46 + -fVar70 * fVar70 + -fVar47 * fVar47;
      fVar55 = fVar82 * fVar82 - fVar46 * fVar46;
      fVar75 = fVar70 * fVar70 + fVar55 + -fVar47 * fVar47;
      fVar22 = fVar46 * fVar47 - fVar82 * fVar70;
      fVar73 = fVar82 * fVar70 + fVar46 * fVar47;
      fVar48 = fVar70 * fVar47 + fVar82 * fVar46;
      fVar57 = fVar70 * fVar47 - fVar82 * fVar46;
      fVar74 = fVar74 + fVar74;
      fVar22 = fVar22 + fVar22;
      fVar47 = fVar47 * fVar47 + fVar55 + -fVar70 * fVar70;
      in_XMM12_Da = 0.0;
      in_XMM12_Db = 0.0;
      in_XMM12_Dc = 1.0;
      in_XMM12_Dd = 0.0;
      in_XMM4_Da = fVar63 * 1.0 + fVar74 * 0.0 + fVar22 * 0.0;
      in_XMM4_Db = fVar63 * 0.0 + fVar74 * 1.0 + fVar22 * 0.0;
      in_XMM4_Dc = fVar63 * 0.0 + fVar74 * 0.0 + fVar22 * 1.0;
      in_XMM4_Dd = fVar63 * 0.0 + fVar74 * 0.0 + fVar22 * 0.0;
      fVar48 = fVar48 + fVar48;
      fVar39 = fVar39 + fVar39;
      auVar49._0_4_ = fVar39 * 1.0 + fVar75 * 0.0 + fVar48 * 0.0;
      auVar49._4_4_ = fVar39 * 0.0 + fVar75 * 1.0 + fVar48 * 0.0;
      auVar49._8_4_ = fVar39 * 0.0 + fVar75 * 0.0 + fVar48 * 1.0;
      fVar63 = fVar39 * 0.0 + fVar75 * 0.0 + fVar48 * 0.0;
      fVar73 = fVar73 + fVar73;
      fVar57 = fVar57 + fVar57;
      fVar82 = fVar73 * 1.0 + fVar57 * 0.0 + fVar47 * 0.0;
      fVar39 = fVar73 * 0.0 + fVar57 * 1.0 + fVar47 * 0.0;
      fVar46 = fVar73 * 0.0 + fVar57 * 0.0 + fVar47 * 1.0;
      fVar47 = fVar73 * 0.0 + fVar57 * 0.0 + fVar47 * 0.0;
      fVar57 = fVar83 * fVar82;
      in_XMM3_Db = fVar83 * fVar39;
      in_XMM3_Dc = fVar83 * fVar46;
      in_XMM3_Dd = fVar83 * fVar47;
      auVar58._0_4_ = fVar71 * fVar82;
      auVar58._4_4_ = fVar71 * fVar39;
      auVar58._8_4_ = fVar71 * fVar46;
      in_XMM6_Da = fVar82 * 0.0;
      in_XMM6_Db = fVar39 * 0.0;
      in_XMM6_Dc = fVar46 * 0.0;
      in_XMM6_Dd = fVar47 * 0.0;
      in_XMM11_Da = fVar41 * in_XMM4_Da + auVar49._0_4_ * 0.0 + in_XMM6_Da;
      in_XMM11_Db = fVar41 * in_XMM4_Db + auVar49._4_4_ * 0.0 + in_XMM6_Db;
      in_XMM11_Dc = fVar41 * in_XMM4_Dc + auVar49._8_4_ * 0.0 + in_XMM6_Dc;
      in_XMM11_Dd = fVar41 * in_XMM4_Dd + fVar63 * 0.0 + in_XMM6_Dd;
      in_XMM14._0_4_ = fVar40 * in_XMM4_Da + fVar52 * auVar49._0_4_ + in_XMM6_Da;
      in_XMM14._4_4_ = fVar40 * in_XMM4_Db + fVar52 * auVar49._4_4_ + in_XMM6_Db;
      in_XMM14._8_4_ = fVar40 * in_XMM4_Dc + fVar52 * auVar49._8_4_ + in_XMM6_Dc;
      in_XMM14._12_4_ = fVar40 * in_XMM4_Dd + fVar52 * fVar63 + in_XMM6_Dd;
      auVar25._0_4_ = fVar61 * auVar49._0_4_ + fVar57;
      auVar25._4_4_ = fVar61 * auVar49._4_4_ + in_XMM3_Db;
      auVar25._8_4_ = fVar61 * auVar49._8_4_ + in_XMM3_Dc;
      in_XMM13_Da = fVar68 * in_XMM4_Da + auVar25._0_4_;
      in_XMM13_Db = fVar68 * in_XMM4_Db + auVar25._4_4_;
      in_XMM13_Dc = fVar68 * in_XMM4_Dc + auVar25._8_4_;
      in_XMM13_Dd = fVar68 * in_XMM4_Dd + fVar61 * fVar63 + in_XMM3_Dd;
      a0.field_0._0_4_ = fVar69 * auVar49._0_4_ + auVar58._0_4_;
      a0.field_0._4_4_ = fVar69 * auVar49._4_4_ + auVar58._4_4_;
      a0.field_0._8_4_ = fVar69 * auVar49._8_4_ + auVar58._8_4_;
      in_XMM15_Da = fVar84 * in_XMM4_Da + a0.field_0._0_4_ + in_XMM10_Db * fVar56 + fVar51 + 0.0;
      in_XMM15_Db = fVar84 * in_XMM4_Db + a0.field_0._4_4_ + in_XMM10_Dc * fVar56 + fVar53 + 0.0;
      in_XMM15_Dc = fVar84 * in_XMM4_Dc + a0.field_0._8_4_ + fVar54 + in_XMM15_Dc * fVar45 + 0.0;
      in_XMM15_Dd = fVar84 * in_XMM4_Dd + fVar69 * fVar63 + fVar71 * fVar47 + 0.0;
      _local_1b8 = auVar27;
    }
    else {
      if (iVar7 < 0x9244) {
        if (iVar7 == 0x9134) {
          lVar20 = *plVar9;
          lVar18 = plVar9[2] * uVar19;
          in_XMM11_Db = *(float *)(lVar20 + 0x10 + lVar18);
          in_XMM11_Da = *(float *)(lVar20 + lVar18);
          in_XMM13_Da = *(float *)(lVar20 + 8 + lVar18);
          in_XMM11_Dc = *(float *)(lVar20 + 0x20 + lVar18);
          in_XMM11_Dd = 0.0;
          in_XMM14._4_4_ = (float)*(undefined4 *)(lVar20 + 0x14 + lVar18);
          in_XMM14._0_4_ = (float)*(undefined4 *)(lVar20 + 4 + lVar18);
          in_XMM14._8_4_ = (float)*(undefined4 *)(lVar20 + 0x24 + lVar18);
          in_XMM14._12_4_ = 0.0;
          in_XMM13_Db = *(float *)(lVar20 + 0x18 + lVar18);
          in_XMM13_Dc = *(float *)(lVar20 + 0x28 + lVar18);
          in_XMM13_Dd = 0.0;
          auVar37._4_4_ = *(undefined4 *)(lVar20 + 0x1c + lVar18);
          auVar37._0_4_ = *(undefined4 *)(lVar20 + 0xc + lVar18);
          uVar62 = *(uint *)(lVar20 + 0x2c + lVar18);
          auVar44 = ZEXT416(uVar62);
          auVar37._8_4_ = uVar62;
          auVar37._12_4_ = 0;
        }
        else if (iVar7 == 0x9234) {
          lVar20 = *plVar9;
          lVar18 = plVar9[2] * uVar19;
          uVar5 = *(undefined8 *)(lVar20 + 4 + lVar18);
          in_XMM11_Da = *(float *)(lVar20 + lVar18);
          in_XMM11_Db = (float)uVar5;
          in_XMM11_Dc = (float)((ulong)uVar5 >> 0x20);
          in_XMM11_Dd = 0.0;
          uVar5 = *(undefined8 *)(lVar20 + 0x10 + lVar18);
          in_XMM14._4_4_ = (float)(int)uVar5;
          in_XMM14._0_4_ = (float)*(undefined4 *)(lVar20 + 0xc + lVar18);
          in_XMM14._8_4_ = (float)(int)((ulong)uVar5 >> 0x20);
          in_XMM14._12_4_ = 0.0;
          uVar5 = *(undefined8 *)(lVar20 + 0x1c + lVar18);
          in_XMM13_Da = *(float *)(lVar20 + 0x18 + lVar18);
          in_XMM13_Db = (float)uVar5;
          in_XMM13_Dc = (float)((ulong)uVar5 >> 0x20);
          in_XMM13_Dd = 0.0;
          uVar17 = *(ulong *)(lVar20 + 0x28 + lVar18);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar17;
          auVar37._4_4_ = (int)uVar17;
          auVar37._0_4_ = *(undefined4 *)(lVar20 + 0x24 + lVar18);
          auVar37._8_4_ = (int)(uVar17 >> 0x20);
          auVar37._12_4_ = 0;
        }
      }
      else if (iVar7 == 0xb001) {
        lVar20 = *plVar9;
        lVar18 = plVar9[2] * uVar19;
        uVar5 = *(undefined8 *)(lVar20 + 0x10 + lVar18);
        in_XMM13_Da = (float)uVar5;
        in_XMM13_Db = (float)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar20 + 0x34 + lVar18);
        in_XMM11_Da = *(float *)(lVar20 + lVar18);
        in_XMM13_Dc = *(float *)(lVar20 + 8 + lVar18);
        in_XMM4_Db = 0.0;
        in_XMM4_Dc = 0.0;
        in_XMM4_Dd = 0.0;
        in_XMM14._4_4_ = (float)*(undefined4 *)(lVar20 + 4 + lVar18);
        in_XMM14._0_4_ = (float)*(undefined4 *)(lVar20 + 0xc + lVar18);
        in_XMM11_Db = (float)uVar5;
        in_XMM11_Dc = (float)((ulong)uVar5 >> 0x20);
        pfVar1 = (float *)(lVar20 + 0x1c + lVar18);
        fVar84 = *pfVar1;
        fVar63 = pfVar1[1];
        fVar39 = 0.0;
        fVar82 = 0.0;
        fVar57 = *(float *)(lVar20 + 0x24 + lVar18);
        fVar61 = *(float *)(lVar20 + 0x28 + lVar18);
        fVar83 = *(float *)(lVar20 + 0x2c + lVar18);
        fVar41 = *(float *)(lVar20 + 0x30 + lVar18);
        auVar58._4_8_ = 0;
        auVar58._0_4_ = fVar41;
        fVar46 = fVar41 * fVar41 + fVar83 * fVar83 + fVar57 * fVar57 + fVar61 * fVar61;
        auVar27 = rsqrtss(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
        fVar40 = auVar27._0_4_;
        fVar40 = fVar40 * fVar40 * fVar46 * -0.5 * fVar40 + fVar40 * 1.5;
        auVar27._0_4_ = fVar57 * fVar40;
        in_XMM11_Dd = fVar61 * fVar40;
        auVar49._0_4_ = fVar83 * fVar40;
        auVar49._4_8_ = 0;
        in_XMM13_Dd = fVar40 * fVar41;
        in_XMM6_Db = 0.0;
        in_XMM6_Dd = 0.0;
        auVar44._0_8_ = CONCAT44(auVar49._0_4_,*(undefined4 *)(lVar20 + 0x3c + lVar18));
        auVar44._8_8_ = 0;
        in_XMM14._8_8_ = auVar44._0_8_;
        auVar27._4_4_ = 0;
        auVar27._8_4_ = fVar63;
        auVar27._12_4_ = 0;
        auVar37._4_4_ = fVar84;
        auVar37._0_4_ = *(undefined4 *)(lVar20 + 0x18 + lVar18);
        auVar37._8_4_ = fVar63;
        auVar37._12_4_ = auVar27._0_4_;
        in_XMM4_Da = in_XMM13_Dc;
        in_XMM6_Da = in_XMM11_Dd;
        in_XMM6_Dc = in_XMM11_Dc;
      }
      else if (iVar7 == 0x9244) {
        lVar20 = *plVar9;
        lVar18 = plVar9[2] * uVar19;
        pfVar1 = (float *)(lVar20 + lVar18);
        in_XMM11_Da = *pfVar1;
        in_XMM11_Db = pfVar1[1];
        in_XMM11_Dc = pfVar1[2];
        in_XMM11_Dd = pfVar1[3];
        in_XMM14 = *(undefined1 (*) [16])(lVar20 + 0x10 + lVar18);
        pfVar1 = (float *)(lVar20 + 0x20 + lVar18);
        in_XMM13_Da = *pfVar1;
        in_XMM13_Db = pfVar1[1];
        in_XMM13_Dc = pfVar1[2];
        in_XMM13_Dd = pfVar1[3];
        auVar37 = *(undefined1 (*) [16])(lVar20 + 0x30 + lVar18);
      }
      auVar25 = auVar37._0_12_;
      lVar20 = (ulong)(uVar16 + 1) * 0x38;
      plVar9 = (long *)(lVar10 + lVar20);
      iVar7 = *(int *)(lVar10 + 0x20 + lVar20);
      if (iVar7 < 0x9244) {
        if (iVar7 == 0x9134) {
          lVar10 = *plVar9;
          lVar20 = uVar19 * plVar9[2];
          fVar63 = *(float *)(lVar10 + 0x10 + lVar20);
          fVar84 = *(float *)(lVar10 + lVar20);
          in_XMM4_Da = *(float *)(lVar10 + 0xc + lVar20);
          fVar39 = *(float *)(lVar10 + 0x20 + lVar20);
          fVar82 = 0.0;
          auVar27._4_4_ = *(undefined4 *)(lVar10 + 0x14 + lVar20);
          auVar27._0_4_ = (float)*(undefined4 *)(lVar10 + 4 + lVar20);
          auVar27._8_4_ = *(undefined4 *)(lVar10 + 0x24 + lVar20);
          auVar27._12_4_ = 0;
          auVar44._4_4_ = *(undefined4 *)(lVar10 + 0x18 + lVar20);
          auVar44._0_4_ = *(undefined4 *)(lVar10 + 8 + lVar20);
          auVar44._8_4_ = *(undefined4 *)(lVar10 + 0x28 + lVar20);
          auVar44._12_4_ = 0;
          in_XMM4_Db = *(float *)(lVar10 + 0x1c + lVar20);
          in_XMM4_Dc = *(float *)(lVar10 + 0x2c + lVar20);
          auVar49._4_8_ = 0;
          auVar49._0_4_ = in_XMM4_Dc;
          in_XMM4_Dd = 0.0;
        }
        else if (iVar7 == 0x9234) {
          lVar10 = *plVar9;
          lVar20 = uVar19 * plVar9[2];
          uVar5 = *(undefined8 *)(lVar10 + 4 + lVar20);
          fVar84 = *(float *)(lVar10 + lVar20);
          fVar63 = (float)uVar5;
          fVar39 = (float)((ulong)uVar5 >> 0x20);
          fVar82 = 0.0;
          uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar20);
          auVar27._4_4_ = (int)uVar5;
          auVar27._0_4_ = (float)*(undefined4 *)(lVar10 + 0xc + lVar20);
          auVar27._8_4_ = (int)((ulong)uVar5 >> 0x20);
          auVar27._12_4_ = 0;
          uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar20);
          auVar44._4_4_ = (int)uVar5;
          auVar44._0_4_ = *(undefined4 *)(lVar10 + 0x18 + lVar20);
          auVar44._8_4_ = (int)((ulong)uVar5 >> 0x20);
          auVar44._12_4_ = 0;
          uVar19 = *(ulong *)(lVar10 + 0x28 + lVar20);
          auVar49._8_4_ = 0.0;
          auVar49._0_8_ = uVar19;
          in_XMM4_Da = *(float *)(lVar10 + 0x24 + lVar20);
          in_XMM4_Db = (float)uVar19;
          in_XMM4_Dc = (float)(uVar19 >> 0x20);
          in_XMM4_Dd = 0.0;
        }
      }
      else if (iVar7 == 0xb001) {
        lVar10 = *plVar9;
        lVar20 = uVar19 * plVar9[2];
        uVar5 = *(undefined8 *)(lVar10 + 0x34 + lVar20);
        fVar84 = *(float *)(lVar10 + lVar20);
        auVar27._4_4_ = *(undefined4 *)(lVar10 + 4 + lVar20);
        auVar27._0_4_ = (float)*(undefined4 *)(lVar10 + 0xc + lVar20);
        in_XMM4_Da = *(float *)(lVar10 + 0x18 + lVar20);
        pfVar1 = (float *)(lVar10 + 0x1c + lVar20);
        in_XMM4_Db = *pfVar1;
        in_XMM4_Dc = pfVar1[1];
        in_XMM6_Dc = 0.0;
        in_XMM6_Dd = 0.0;
        fVar57 = *(float *)(lVar10 + 0x24 + lVar20);
        fVar82 = *(float *)(lVar10 + 0x28 + lVar20);
        fVar61 = *(float *)(lVar10 + 0x2c + lVar20);
        fVar63 = *(float *)(lVar10 + 0x30 + lVar20);
        fVar39 = fVar63 * fVar63 + fVar61 * fVar61 + fVar57 * fVar57 + fVar82 * fVar82;
        auVar44 = rsqrtss(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39));
        fVar83 = auVar44._0_4_;
        fVar83 = fVar83 * fVar83 * fVar39 * -0.5 * fVar83 + fVar83 * 1.5;
        auVar58._0_4_ = fVar57 * fVar83;
        fVar82 = fVar82 * fVar83;
        auVar44._8_4_ = *(undefined4 *)(lVar10 + 8 + lVar20);
        auVar44._0_8_ = *(undefined8 *)(lVar10 + 0x10 + lVar20);
        auVar44._12_4_ = fVar83 * fVar63;
        fVar39 = (float)((ulong)uVar5 >> 0x20);
        fVar63 = (float)uVar5;
        auVar49._0_8_ = CONCAT44(fVar61 * fVar83,*(undefined4 *)(lVar10 + 0x3c + lVar20));
        auVar49._8_4_ = 0.0;
        auVar27._8_8_ = auVar49._0_8_;
        auVar58._4_4_ = 0.0;
        auVar58._8_4_ = in_XMM4_Dc;
        in_XMM4_Dd = auVar58._0_4_;
        in_XMM6_Da = in_XMM4_Db;
        in_XMM6_Db = in_XMM4_Dc;
      }
      else if (iVar7 == 0x9244) {
        lVar10 = *plVar9;
        lVar20 = uVar19 * plVar9[2];
        pfVar1 = (float *)(lVar10 + lVar20);
        fVar84 = *pfVar1;
        fVar63 = pfVar1[1];
        fVar39 = pfVar1[2];
        fVar82 = pfVar1[3];
        auVar27 = *(undefined1 (*) [16])(lVar10 + 0x10 + lVar20);
        auVar44 = *(undefined1 (*) [16])(lVar10 + 0x20 + lVar20);
        pfVar1 = (float *)(lVar10 + 0x30 + lVar20);
        in_XMM4_Da = *pfVar1;
        in_XMM4_Db = pfVar1[1];
        in_XMM4_Dc = pfVar1[2];
        in_XMM4_Dd = pfVar1[3];
      }
      fVar83 = 1.0 - fVar45;
      in_XMM11_Da = in_XMM11_Da * fVar83 + fVar84 * fVar45;
      in_XMM11_Db = in_XMM11_Db * fVar83 + fVar63 * fVar45;
      in_XMM11_Dc = in_XMM11_Dc * fVar83 + fVar39 * fVar45;
      in_XMM11_Dd = in_XMM11_Dd * fVar83 + fVar82 * fVar45;
      fVar57 = auVar27._0_4_ * fVar45;
      in_XMM3_Db = auVar27._4_4_ * fVar45;
      in_XMM3_Dc = auVar27._8_4_ * fVar45;
      in_XMM3_Dd = auVar27._12_4_ * fVar45;
      fVar61 = in_XMM14._4_4_;
      fVar63 = in_XMM14._8_4_;
      fVar82 = in_XMM14._12_4_;
      in_XMM14._0_4_ = in_XMM14._0_4_ * fVar83 + fVar57;
      in_XMM14._4_4_ = fVar61 * fVar83 + in_XMM3_Db;
      in_XMM14._8_4_ = fVar63 * fVar83 + in_XMM3_Dc;
      in_XMM14._12_4_ = fVar82 * fVar83 + in_XMM3_Dd;
      a0.field_0._0_4_ = auVar44._0_4_ * fVar45;
      a0.field_0._4_4_ = auVar44._4_4_ * fVar45;
      a0.field_0._8_4_ = auVar44._8_4_ * fVar45;
      in_XMM13_Da = in_XMM13_Da * fVar83 + a0.field_0._0_4_;
      in_XMM13_Db = in_XMM13_Db * fVar83 + a0.field_0._4_4_;
      in_XMM13_Dc = in_XMM13_Dc * fVar83 + a0.field_0._8_4_;
      in_XMM13_Dd = in_XMM13_Dd * fVar83 + auVar44._12_4_ * fVar45;
      in_XMM12_Da = fVar45 * in_XMM4_Da;
      in_XMM12_Db = fVar45 * in_XMM4_Db;
      in_XMM12_Dc = fVar45 * in_XMM4_Dc;
      in_XMM12_Dd = fVar45 * in_XMM4_Dd;
      in_XMM15_Da = fVar83 * auVar37._0_4_ + in_XMM12_Da;
      in_XMM15_Db = fVar83 * auVar37._4_4_ + in_XMM12_Db;
      in_XMM15_Dc = fVar83 * auVar37._8_4_ + in_XMM12_Dc;
      in_XMM15_Dd = fVar83 * auVar37._12_4_ + in_XMM12_Dd;
    }
  }
  uVar19 = (ulong)prim->primID_;
  if (pGVar8->numTimeSteps == 1) {
    plVar9 = *(long **)&pGVar8[1].fnumTimeSegments;
    iVar7 = (int)plVar9[4];
    if ((pGVar8->field_8).field_0x1 == '\x01') {
      fVar61 = in_XMM11_Da;
      fVar82 = in_XMM11_Db;
      fVar83 = in_XMM11_Dc;
      fVar63 = in_XMM11_Dd;
      if (iVar7 < 0x9244) {
        if (iVar7 == 0x9134) {
          lVar10 = *plVar9;
          lVar20 = uVar19 * plVar9[2];
          fVar57 = *(float *)(lVar10 + 4 + lVar20);
          in_XMM6_Da = *(float *)(lVar10 + 8 + lVar20);
          in_XMM4_Da = *(float *)(lVar10 + 0xc + lVar20);
          in_XMM3_Db = *(float *)(lVar10 + 0x14 + lVar20);
          in_XMM3_Dc = *(float *)(lVar10 + 0x24 + lVar20);
          in_XMM3_Dd = 0.0;
          in_XMM6_Db = *(float *)(lVar10 + 0x18 + lVar20);
          in_XMM6_Dc = *(float *)(lVar10 + 0x28 + lVar20);
          in_XMM6_Dd = 0.0;
          in_XMM4_Db = *(float *)(lVar10 + 0x1c + lVar20);
          in_XMM4_Dc = *(float *)(lVar10 + 0x2c + lVar20);
          in_XMM4_Dd = 0.0;
          fVar61 = *(float *)(lVar10 + lVar20);
          fVar82 = *(float *)(lVar10 + 0x10 + lVar20);
          fVar83 = *(float *)(lVar10 + 0x20 + lVar20);
          fVar63 = 0.0;
        }
        else if (iVar7 == 0x9234) {
          lVar10 = *plVar9;
          lVar20 = uVar19 * plVar9[2];
          uVar5 = *(undefined8 *)(lVar10 + 4 + lVar20);
          uVar6 = *(undefined8 *)(lVar10 + 0x10 + lVar20);
          fVar57 = *(float *)(lVar10 + 0xc + lVar20);
          in_XMM3_Db = (float)uVar6;
          in_XMM3_Dc = (float)((ulong)uVar6 >> 0x20);
          in_XMM3_Dd = 0.0;
          uVar6 = *(undefined8 *)(lVar10 + 0x1c + lVar20);
          in_XMM6_Da = *(float *)(lVar10 + 0x18 + lVar20);
          in_XMM6_Db = (float)uVar6;
          in_XMM6_Dc = (float)((ulong)uVar6 >> 0x20);
          in_XMM6_Dd = 0.0;
          uVar6 = *(undefined8 *)(lVar10 + 0x28 + lVar20);
          in_XMM4_Da = *(float *)(lVar10 + 0x24 + lVar20);
          in_XMM4_Db = (float)uVar6;
          in_XMM4_Dc = (float)((ulong)uVar6 >> 0x20);
          in_XMM4_Dd = 0.0;
          fVar61 = *(float *)(lVar10 + lVar20);
          fVar82 = (float)uVar5;
          fVar83 = (float)((ulong)uVar5 >> 0x20);
          fVar63 = 0.0;
        }
      }
      else if (iVar7 == 0xb001) {
        lVar10 = *plVar9;
        lVar20 = uVar19 * plVar9[2];
        pfVar1 = (float *)(lVar10 + 0x10 + lVar20);
        in_XMM6_Da = *pfVar1;
        in_XMM6_Db = pfVar1[1];
        uVar5 = *(undefined8 *)(lVar10 + 0x34 + lVar20);
        fVar61 = *(float *)(lVar10 + lVar20);
        in_XMM3_Db = *(float *)(lVar10 + 4 + lVar20);
        in_XMM6_Dc = *(float *)(lVar10 + 8 + lVar20);
        fVar57 = *(float *)(lVar10 + 0xc + lVar20);
        fVar82 = (float)uVar5;
        fVar83 = (float)((ulong)uVar5 >> 0x20);
        in_XMM4_Da = *(float *)(lVar10 + 0x18 + lVar20);
        uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar20);
        fVar84 = *(float *)(lVar10 + 0x24 + lVar20);
        fVar63 = *(float *)(lVar10 + 0x28 + lVar20);
        fVar39 = *(float *)(lVar10 + 0x2c + lVar20);
        fVar41 = *(float *)(lVar10 + 0x30 + lVar20);
        fVar45 = fVar41 * fVar41 + fVar39 * fVar39 + fVar84 * fVar84 + fVar63 * fVar63;
        auVar27 = rsqrtss(ZEXT416((uint)fVar45),ZEXT416((uint)fVar45));
        fVar40 = auVar27._0_4_;
        fVar40 = fVar40 * fVar40 * fVar45 * -0.5 * fVar40 + fVar40 * 1.5;
        in_XMM4_Dd = fVar84 * fVar40;
        fVar63 = fVar63 * fVar40;
        in_XMM3_Dd = fVar39 * fVar40;
        in_XMM6_Dd = fVar40 * fVar41;
        in_XMM3_Dc = *(float *)(lVar10 + 0x3c + lVar20);
        in_XMM4_Dc = (float)((ulong)uVar5 >> 0x20);
        in_XMM4_Db = (float)uVar5;
      }
      else if (iVar7 == 0x9244) {
        lVar10 = *plVar9;
        lVar20 = uVar19 * plVar9[2];
        pfVar1 = (float *)(lVar10 + lVar20);
        fVar61 = *pfVar1;
        fVar82 = pfVar1[1];
        fVar83 = pfVar1[2];
        fVar63 = pfVar1[3];
        pfVar1 = (float *)(lVar10 + 0x10 + lVar20);
        fVar57 = *pfVar1;
        in_XMM3_Db = pfVar1[1];
        in_XMM3_Dc = pfVar1[2];
        in_XMM3_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar10 + 0x20 + lVar20);
        in_XMM6_Da = *pfVar1;
        in_XMM6_Db = pfVar1[1];
        in_XMM6_Dc = pfVar1[2];
        in_XMM6_Dd = pfVar1[3];
        pfVar1 = (float *)(lVar10 + 0x30 + lVar20);
        in_XMM4_Da = *pfVar1;
        in_XMM4_Db = pfVar1[1];
        in_XMM4_Dc = pfVar1[2];
        in_XMM4_Dd = pfVar1[3];
      }
      fVar47 = fVar63 * in_XMM3_Dd + in_XMM4_Dd * in_XMM6_Dd;
      fVar46 = fVar63 * in_XMM3_Dd - in_XMM4_Dd * in_XMM6_Dd;
      fVar41 = in_XMM4_Dd * in_XMM4_Dd + fVar63 * fVar63 + -in_XMM3_Dd * in_XMM3_Dd +
               -in_XMM6_Dd * in_XMM6_Dd;
      fVar39 = in_XMM4_Dd * in_XMM4_Dd - fVar63 * fVar63;
      fVar52 = in_XMM3_Dd * in_XMM3_Dd + fVar39 + -in_XMM6_Dd * in_XMM6_Dd;
      fVar84 = fVar63 * in_XMM6_Dd - in_XMM4_Dd * in_XMM3_Dd;
      fVar51 = in_XMM4_Dd * in_XMM3_Dd + fVar63 * in_XMM6_Dd;
      fVar53 = in_XMM3_Dd * in_XMM6_Dd + fVar63 * in_XMM4_Dd;
      fVar63 = in_XMM3_Dd * in_XMM6_Dd - fVar63 * in_XMM4_Dd;
      fVar47 = fVar47 + fVar47;
      fVar84 = fVar84 + fVar84;
      fVar39 = in_XMM6_Dd * in_XMM6_Dd + fVar39 + -in_XMM3_Dd * in_XMM3_Dd;
      fVar40 = fVar41 * 1.0 + fVar47 * 0.0 + fVar84 * 0.0;
      fVar45 = fVar41 * 0.0 + fVar47 * 1.0 + fVar84 * 0.0;
      fVar84 = fVar41 * 0.0 + fVar47 * 0.0 + fVar84 * 1.0;
      fVar53 = fVar53 + fVar53;
      fVar46 = fVar46 + fVar46;
      fVar41 = fVar46 * 1.0 + fVar52 * 0.0 + fVar53 * 0.0;
      fVar47 = fVar46 * 0.0 + fVar52 * 1.0 + fVar53 * 0.0;
      fVar46 = fVar46 * 0.0 + fVar52 * 0.0 + fVar53 * 1.0;
      fVar51 = fVar51 + fVar51;
      fVar63 = fVar63 + fVar63;
      fVar52 = fVar51 * 1.0 + fVar63 * 0.0 + fVar39 * 0.0;
      fVar53 = fVar51 * 0.0 + fVar63 * 1.0 + fVar39 * 0.0;
      fVar63 = fVar51 * 0.0 + fVar63 * 0.0 + fVar39 * 1.0;
      in_XMM12_Da = fVar61 * fVar40 + fVar41 * 0.0 + fVar52 * 0.0;
      in_XMM12_Db = fVar61 * fVar45 + fVar47 * 0.0 + fVar53 * 0.0;
      in_XMM12_Dc = fVar61 * fVar84 + fVar46 * 0.0 + fVar63 * 0.0;
      a0.field_0._0_4_ = fVar57 * fVar40 + in_XMM3_Db * fVar41 + fVar52 * 0.0;
      a0.field_0._4_4_ = fVar57 * fVar45 + in_XMM3_Db * fVar47 + fVar53 * 0.0;
      a0.field_0._8_4_ = fVar57 * fVar84 + in_XMM3_Db * fVar46 + fVar63 * 0.0;
      auVar25._0_4_ = in_XMM6_Da * fVar40 + in_XMM6_Db * fVar41 + in_XMM6_Dc * fVar52;
      auVar25._4_4_ = in_XMM6_Da * fVar45 + in_XMM6_Db * fVar47 + in_XMM6_Dc * fVar53;
      auVar25._8_4_ = in_XMM6_Da * fVar84 + in_XMM6_Db * fVar46 + in_XMM6_Dc * fVar63;
      auVar49._0_4_ = in_XMM4_Da * fVar40 + in_XMM4_Db * fVar41 + in_XMM4_Dc * fVar52 + fVar82 + 0.0
      ;
      auVar49._4_4_ = in_XMM4_Da * fVar45 + in_XMM4_Db * fVar47 + in_XMM4_Dc * fVar53 + fVar83 + 0.0
      ;
      auVar49._8_4_ =
           in_XMM4_Da * fVar84 + in_XMM4_Db * fVar46 + in_XMM4_Dc * fVar63 + in_XMM3_Dc + 0.0;
    }
    else if (iVar7 < 0x9244) {
      if (iVar7 == 0x9134) {
        lVar10 = *plVar9;
        lVar20 = uVar19 * plVar9[2];
        in_XMM12_Db = *(float *)(lVar10 + 0x10 + lVar20);
        in_XMM12_Da = *(float *)(lVar10 + lVar20);
        in_XMM12_Dc = *(float *)(lVar10 + 0x20 + lVar20);
        a0.field_0._4_4_ = (float)*(undefined4 *)(lVar10 + 0x14 + lVar20);
        a0.field_0._0_4_ = (float)*(undefined4 *)(lVar10 + 4 + lVar20);
        a0.field_0._8_4_ = (float)*(undefined4 *)(lVar10 + 0x24 + lVar20);
        auVar25._4_4_ = (float)*(undefined4 *)(lVar10 + 0x18 + lVar20);
        auVar25._0_4_ = (float)*(undefined4 *)(lVar10 + 8 + lVar20);
        auVar25._8_4_ = (float)*(undefined4 *)(lVar10 + 0x28 + lVar20);
        auVar49._4_4_ = (float)*(undefined4 *)(lVar10 + 0x1c + lVar20);
        auVar49._0_4_ = (float)*(undefined4 *)(lVar10 + 0xc + lVar20);
        auVar49._8_4_ = (float)*(undefined4 *)(lVar10 + 0x2c + lVar20);
      }
      else if (iVar7 == 0x9234) {
        lVar10 = *plVar9;
        lVar20 = uVar19 * plVar9[2];
        uVar5 = *(undefined8 *)(lVar10 + 4 + lVar20);
        in_XMM12_Da = *(float *)(lVar10 + lVar20);
        in_XMM12_Db = (float)uVar5;
        in_XMM12_Dc = (float)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar20);
        a0.field_0._4_4_ = (float)(int)uVar5;
        a0.field_0._0_4_ = (float)*(undefined4 *)(lVar10 + 0xc + lVar20);
        a0.field_0._8_4_ = (float)(int)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar20);
        auVar25._4_4_ = (float)(int)uVar5;
        auVar25._0_4_ = (float)*(undefined4 *)(lVar10 + 0x18 + lVar20);
        auVar25._8_4_ = (float)(int)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar10 + 0x28 + lVar20);
        auVar49._4_4_ = (float)(int)uVar5;
        auVar49._0_4_ = (float)*(undefined4 *)(lVar10 + 0x24 + lVar20);
        auVar49._8_4_ = (float)(int)((ulong)uVar5 >> 0x20);
      }
    }
    else if (iVar7 == 0xb001) {
      lVar10 = *plVar9;
      lVar20 = uVar19 * plVar9[2];
      uVar5 = *(undefined8 *)(lVar10 + 0x34 + lVar20);
      in_XMM12_Da = *(float *)(lVar10 + lVar20);
      auVar34._4_4_ = *(undefined4 *)(lVar10 + 4 + lVar20);
      auVar34._0_4_ = *(undefined4 *)(lVar10 + 0xc + lVar20);
      uVar6 = *(undefined8 *)(lVar10 + 0x1c + lVar20);
      fVar57 = *(float *)(lVar10 + 0x24 + lVar20);
      fVar61 = *(float *)(lVar10 + 0x28 + lVar20);
      fVar63 = *(float *)(lVar10 + 0x2c + lVar20);
      fVar82 = *(float *)(lVar10 + 0x30 + lVar20);
      fVar61 = fVar82 * fVar82 + fVar63 * fVar63 + fVar57 * fVar57 + fVar61 * fVar61;
      auVar27 = rsqrtss(ZEXT416((uint)fVar61),ZEXT416((uint)fVar61));
      fVar57 = auVar27._0_4_;
      in_XMM12_Db = (float)uVar5;
      in_XMM12_Dc = (float)((ulong)uVar5 >> 0x20);
      auVar25._8_4_ = (float)*(undefined4 *)(lVar10 + 8 + lVar20);
      auVar25._0_8_ = *(undefined8 *)(lVar10 + 0x10 + lVar20);
      auVar34._12_4_ = fVar63 * (fVar57 * fVar57 * fVar61 * -0.5 * fVar57 + fVar57 * 1.5);
      auVar34._8_4_ = *(undefined4 *)(lVar10 + 0x3c + lVar20);
      a0.field_0._0_12_ = auVar34._0_12_;
      auVar49._4_4_ = (float)(int)uVar6;
      auVar49._0_4_ = (float)*(undefined4 *)(lVar10 + 0x18 + lVar20);
      auVar49._8_4_ = (float)(int)((ulong)uVar6 >> 0x20);
    }
    else if (iVar7 == 0x9244) {
      lVar10 = *plVar9;
      lVar20 = uVar19 * plVar9[2];
      pfVar1 = (float *)(lVar10 + lVar20);
      in_XMM12_Da = *pfVar1;
      in_XMM12_Db = pfVar1[1];
      in_XMM12_Dc = pfVar1[2];
      a0.field_0._0_12_ = SUB1612(*(undefined1 (*) [16])(lVar10 + 0x10 + lVar20),0);
      auVar25 = SUB1612(*(undefined1 (*) [16])(lVar10 + 0x20 + lVar20),0);
      auVar49 = SUB1612(*(undefined1 (*) [16])(lVar10 + 0x30 + lVar20),0);
    }
    goto LAB_00a06626;
  }
  fVar57 = pGVar8->fnumTimeSegments;
  fVar54 = 0.0;
  fVar56 = 0.0;
  fVar70 = 0.0;
  fVar61 = (pGVar8->time_range).lower;
  auVar42._4_8_ = 0;
  auVar42._0_4_ = fVar61;
  fVar73 = ((query->time - fVar61) / ((pGVar8->time_range).upper - fVar61)) * fVar57;
  fVar63 = in_XMM11_Da;
  fVar84 = in_XMM11_Db;
  fVar39 = in_XMM11_Dc;
  fVar71 = in_XMM11_Dd;
  fVar45 = in_XMM13_Da;
  fVar52 = in_XMM13_Db;
  fVar53 = in_XMM13_Dc;
  fVar69 = in_XMM13_Dd;
  auVar87 = in_XMM14;
  fVar40 = in_XMM15_Da;
  fVar47 = in_XMM15_Db;
  fVar51 = in_XMM15_Dc;
  fVar68 = in_XMM15_Dd;
  fVar46 = fVar57;
  fVar61 = floorf(fVar73);
  fStack_214 = 0.0;
  fVar82 = 0.0;
  fStack_210 = 0.0;
  fVar83 = 0.0;
  fStack_20c = 0.0;
  fVar41 = 0.0;
  if (fVar57 + -1.0 <= fVar61) {
    fVar61 = fVar57 + -1.0;
  }
  auVar31 = ZEXT812(0);
  if (0.0 <= fVar61) {
    auVar31._4_8_ = 0;
    auVar31._0_4_ = fVar61;
  }
  uVar16 = (uint)auVar31._0_4_;
  fVar73 = fVar73 - auVar31._0_4_;
  lVar10 = *(long *)&pGVar8[1].fnumTimeSegments;
  plVar9 = (long *)(lVar10 + (ulong)uVar16 * 0x38);
  iVar7 = *(int *)(lVar10 + 0x20 + (ulong)uVar16 * 0x38);
  if ((pGVar8->field_8).field_0x1 != '\x01') {
    fVar57 = extraout_XMM0_Db;
    fVar63 = extraout_XMM0_Dc;
    if (iVar7 < 0x9244) {
      if (iVar7 == 0x9134) {
        lVar20 = *plVar9;
        lVar18 = plVar9[2] * uVar19;
        in_XMM12_Db = *(float *)(lVar20 + 0x10 + lVar18);
        in_XMM12_Da = *(float *)(lVar20 + lVar18);
        fVar61 = *(float *)(lVar20 + 8 + lVar18);
        fVar45 = *(float *)(lVar20 + 0xc + lVar18);
        in_XMM12_Dc = *(float *)(lVar20 + 0x20 + lVar18);
        auVar31._4_4_ = *(undefined4 *)(lVar20 + 0x14 + lVar18);
        auVar31._0_4_ = *(undefined4 *)(lVar20 + 4 + lVar18);
        auVar31._8_4_ = *(undefined4 *)(lVar20 + 0x24 + lVar18);
        fVar57 = *(float *)(lVar20 + 0x18 + lVar18);
        fVar63 = *(float *)(lVar20 + 0x28 + lVar18);
        fVar52 = *(float *)(lVar20 + 0x1c + lVar18);
        fVar53 = *(float *)(lVar20 + 0x2c + lVar18);
        auVar42._4_8_ = 0;
        auVar42._0_4_ = fVar53;
      }
      else if (iVar7 == 0x9234) {
        lVar20 = *plVar9;
        lVar18 = plVar9[2] * uVar19;
        uVar5 = *(undefined8 *)(lVar20 + 4 + lVar18);
        in_XMM12_Da = *(float *)(lVar20 + lVar18);
        in_XMM12_Db = (float)uVar5;
        in_XMM12_Dc = (float)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar20 + 0x10 + lVar18);
        auVar31._4_4_ = (int)uVar5;
        auVar31._0_4_ = *(undefined4 *)(lVar20 + 0xc + lVar18);
        auVar31._8_4_ = (int)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar20 + 0x1c + lVar18);
        fVar61 = *(float *)(lVar20 + 0x18 + lVar18);
        fVar57 = (float)uVar5;
        fVar63 = (float)((ulong)uVar5 >> 0x20);
        uVar17 = *(ulong *)(lVar20 + 0x28 + lVar18);
        auVar42._8_4_ = 0;
        auVar42._0_8_ = uVar17;
        fVar45 = *(float *)(lVar20 + 0x24 + lVar18);
        fVar52 = (float)uVar17;
        fVar53 = (float)(uVar17 >> 0x20);
      }
    }
    else if (iVar7 == 0xb001) {
      lVar20 = *plVar9;
      lVar18 = plVar9[2] * uVar19;
      pfVar1 = (float *)(lVar20 + 0x10 + lVar18);
      fVar61 = *pfVar1;
      fVar57 = pfVar1[1];
      pfVar1 = (float *)(lVar20 + 0x34 + lVar18);
      in_XMM12_Db = *pfVar1;
      in_XMM12_Dc = pfVar1[1];
      in_XMM6_Dc = 0.0;
      in_XMM12_Da = *(float *)(lVar20 + lVar18);
      fVar63 = *(float *)(lVar20 + 8 + lVar18);
      auVar35._4_4_ = *(undefined4 *)(lVar20 + 4 + lVar18);
      auVar35._0_4_ = *(undefined4 *)(lVar20 + 0xc + lVar18);
      fVar45 = *(float *)(lVar20 + 0x18 + lVar18);
      pfVar1 = (float *)(lVar20 + 0x1c + lVar18);
      fVar52 = *pfVar1;
      fVar53 = pfVar1[1];
      in_XMM4_Dc = 0.0;
      fVar82 = *(float *)(lVar20 + 0x24 + lVar18);
      fVar83 = *(float *)(lVar20 + 0x28 + lVar18);
      fVar84 = *(float *)(lVar20 + 0x2c + lVar18);
      fVar39 = *(float *)(lVar20 + 0x30 + lVar18);
      fVar83 = fVar39 * fVar39 + fVar84 * fVar84 + fVar82 * fVar82 + fVar83 * fVar83;
      auVar27 = rsqrtss(ZEXT416((uint)fVar83),ZEXT416((uint)fVar83));
      fVar82 = auVar27._0_4_;
      auVar58._0_4_ = fVar84 * (fVar82 * fVar82 * fVar83 * -0.5 * fVar82 + fVar82 * 1.5);
      auVar58._4_8_ = 0;
      auVar42._0_8_ = CONCAT44(auVar58._0_4_,*(undefined4 *)(lVar20 + 0x3c + lVar18));
      auVar42._8_4_ = 0;
      auVar35._8_8_ = auVar42._0_8_;
      auVar31 = auVar35._0_12_;
      in_XMM4_Da = fVar52;
      in_XMM4_Db = fVar53;
      in_XMM6_Da = in_XMM12_Db;
      in_XMM6_Db = in_XMM12_Dc;
    }
    else if (iVar7 == 0x9244) {
      lVar20 = *plVar9;
      lVar18 = plVar9[2] * uVar19;
      pfVar1 = (float *)(lVar20 + lVar18);
      in_XMM12_Da = *pfVar1;
      in_XMM12_Db = pfVar1[1];
      in_XMM12_Dc = pfVar1[2];
      auVar31 = SUB1612(*(undefined1 (*) [16])(lVar20 + 0x10 + lVar18),0);
      pfVar1 = (float *)(lVar20 + 0x20 + lVar18);
      fVar61 = *pfVar1;
      fVar57 = pfVar1[1];
      fVar63 = pfVar1[2];
      pfVar1 = (float *)(lVar20 + 0x30 + lVar18);
      fVar45 = *pfVar1;
      fVar52 = pfVar1[1];
      fVar53 = pfVar1[2];
    }
    lVar20 = (ulong)(uVar16 + 1) * 0x38;
    plVar9 = (long *)(lVar10 + lVar20);
    iVar7 = *(int *)(lVar10 + 0x20 + lVar20);
    if (iVar7 < 0x9244) {
      if (iVar7 == 0x9134) {
        lVar10 = *plVar9;
        lVar20 = uVar19 * plVar9[2];
        in_XMM4_Db = *(float *)(lVar10 + 0x10 + lVar20);
        in_XMM4_Da = *(float *)(lVar10 + lVar20);
        in_XMM6_Da = *(float *)(lVar10 + 4 + lVar20);
        in_XMM4_Dc = *(float *)(lVar10 + 0x20 + lVar20);
        in_XMM6_Db = *(float *)(lVar10 + 0x14 + lVar20);
        in_XMM6_Dc = *(float *)(lVar10 + 0x24 + lVar20);
        auVar42._4_4_ = *(undefined4 *)(lVar10 + 0x18 + lVar20);
        auVar42._0_4_ = *(undefined4 *)(lVar10 + 8 + lVar20);
        auVar42._8_4_ = *(undefined4 *)(lVar10 + 0x28 + lVar20);
        auVar58._4_4_ = (float)*(undefined4 *)(lVar10 + 0x1c + lVar20);
        auVar58._0_4_ = (float)*(undefined4 *)(lVar10 + 0xc + lVar20);
        auVar58._8_4_ = (float)*(undefined4 *)(lVar10 + 0x2c + lVar20);
      }
      else if (iVar7 == 0x9234) {
        lVar10 = *plVar9;
        lVar20 = uVar19 * plVar9[2];
        uVar5 = *(undefined8 *)(lVar10 + 4 + lVar20);
        in_XMM4_Da = *(float *)(lVar10 + lVar20);
        in_XMM4_Db = (float)uVar5;
        in_XMM4_Dc = (float)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar20);
        in_XMM6_Da = *(float *)(lVar10 + 0xc + lVar20);
        in_XMM6_Db = (float)uVar5;
        in_XMM6_Dc = (float)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar20);
        auVar42._4_4_ = (int)uVar5;
        auVar42._0_4_ = *(undefined4 *)(lVar10 + 0x18 + lVar20);
        auVar42._8_4_ = (int)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)(lVar10 + 0x28 + lVar20);
        auVar58._4_4_ = (float)(int)uVar5;
        auVar58._0_4_ = (float)*(undefined4 *)(lVar10 + 0x24 + lVar20);
        auVar58._8_4_ = (float)(int)((ulong)uVar5 >> 0x20);
      }
    }
    else if (iVar7 == 0xb001) {
      lVar10 = *plVar9;
      lVar20 = uVar19 * plVar9[2];
      uVar5 = *(undefined8 *)(lVar10 + 0x34 + lVar20);
      in_XMM4_Da = *(float *)(lVar10 + lVar20);
      in_XMM6_Db = *(float *)(lVar10 + 4 + lVar20);
      in_XMM6_Da = *(float *)(lVar10 + 0xc + lVar20);
      uVar6 = *(undefined8 *)(lVar10 + 0x1c + lVar20);
      fVar82 = *(float *)(lVar10 + 0x24 + lVar20);
      fVar83 = *(float *)(lVar10 + 0x28 + lVar20);
      fVar84 = *(float *)(lVar10 + 0x2c + lVar20);
      fVar39 = *(float *)(lVar10 + 0x30 + lVar20);
      fVar82 = fVar39 * fVar39 + fVar84 * fVar84 + fVar82 * fVar82 + fVar83 * fVar83;
      rsqrtss(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
      auVar42._8_4_ = *(undefined4 *)(lVar10 + 8 + lVar20);
      auVar42._0_8_ = *(undefined8 *)(lVar10 + 0x10 + lVar20);
      local_1b8._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
      in_XMM4_Db = (float)uVar5;
      in_XMM6_Dc = *(float *)(lVar10 + 0x3c + lVar20);
      auVar58._4_4_ = (float)(int)uVar6;
      auVar58._0_4_ = (float)*(undefined4 *)(lVar10 + 0x18 + lVar20);
      auVar58._8_4_ = (float)(int)((ulong)uVar6 >> 0x20);
      in_XMM4_Dc = (float)local_1b8._4_4_;
    }
    else if (iVar7 == 0x9244) {
      lVar10 = *plVar9;
      lVar20 = uVar19 * plVar9[2];
      pfVar1 = (float *)(lVar10 + lVar20);
      in_XMM4_Da = *pfVar1;
      in_XMM4_Db = pfVar1[1];
      in_XMM4_Dc = pfVar1[2];
      pfVar1 = (float *)(lVar10 + 0x10 + lVar20);
      in_XMM6_Da = *pfVar1;
      in_XMM6_Db = pfVar1[1];
      in_XMM6_Dc = pfVar1[2];
      auVar42 = SUB1612(*(undefined1 (*) [16])(lVar10 + 0x20 + lVar20),0);
      auVar58 = SUB1612(*(undefined1 (*) [16])(lVar10 + 0x30 + lVar20),0);
    }
    fVar82 = 1.0 - fVar73;
    in_XMM12_Da = in_XMM12_Da * fVar82 + in_XMM4_Da * fVar73;
    in_XMM12_Db = in_XMM12_Db * fVar82 + in_XMM4_Db * fVar73;
    in_XMM12_Dc = in_XMM12_Dc * fVar82 + in_XMM4_Dc * fVar73;
    a0.field_0._0_4_ = auVar31._0_4_ * fVar82 + in_XMM6_Da * fVar73;
    a0.field_0._4_4_ = auVar31._4_4_ * fVar82 + in_XMM6_Db * fVar73;
    a0.field_0._8_4_ = auVar31._8_4_ * fVar82 + in_XMM6_Dc * fVar73;
    auVar25._0_4_ = fVar61 * fVar82 + auVar42._0_4_ * fVar73;
    auVar25._4_4_ = fVar57 * fVar82 + auVar42._4_4_ * fVar73;
    auVar25._8_4_ = fVar63 * fVar82 + auVar42._8_4_ * fVar73;
    auVar49._0_4_ = fVar82 * fVar45 + fVar73 * auVar58._0_4_;
    auVar49._4_4_ = fVar82 * fVar52 + fVar73 * auVar58._4_4_;
    auVar49._8_4_ = fVar82 * fVar53 + fVar73 * auVar58._8_4_;
    goto LAB_00a06626;
  }
  fVar57 = fVar73;
  if (iVar7 < 0x9244) {
    if (iVar7 == 0x9134) {
      lVar20 = *plVar9;
      lVar18 = plVar9[2] * uVar19;
      fVar82 = *(float *)(lVar20 + 0x10 + lVar18);
      fVar57 = *(float *)(lVar20 + lVar18);
      in_XMM12_Da = *(float *)(lVar20 + 4 + lVar18);
      fVar63 = *(float *)(lVar20 + 8 + lVar18);
      fVar83 = *(float *)(lVar20 + 0x20 + lVar18);
      in_XMM12_Db = *(float *)(lVar20 + 0x14 + lVar18);
      in_XMM12_Dc = *(float *)(lVar20 + 0x24 + lVar18);
      fVar84 = *(float *)(lVar20 + 0x18 + lVar18);
      fVar39 = *(float *)(lVar20 + 0x28 + lVar18);
      auVar33._4_4_ = *(undefined4 *)(lVar20 + 0x1c + lVar18);
      auVar33._0_4_ = *(undefined4 *)(lVar20 + 0xc + lVar18);
      auVar33._8_4_ = *(undefined4 *)(lVar20 + 0x2c + lVar18);
    }
    else {
      fVar82 = fStack_214;
      fVar83 = fStack_210;
      fVar41 = fStack_20c;
      if (iVar7 != 0x9234) goto LAB_00a078ec;
      lVar20 = *plVar9;
      lVar18 = plVar9[2] * uVar19;
      uVar5 = *(undefined8 *)(lVar20 + 4 + lVar18);
      fVar57 = *(float *)(lVar20 + lVar18);
      fVar82 = (float)uVar5;
      fVar83 = (float)((ulong)uVar5 >> 0x20);
      uVar5 = *(undefined8 *)(lVar20 + 0x10 + lVar18);
      in_XMM12_Da = *(float *)(lVar20 + 0xc + lVar18);
      in_XMM12_Db = (float)uVar5;
      in_XMM12_Dc = (float)((ulong)uVar5 >> 0x20);
      uVar5 = *(undefined8 *)(lVar20 + 0x1c + lVar18);
      fVar63 = *(float *)(lVar20 + 0x18 + lVar18);
      fVar84 = (float)uVar5;
      fVar39 = (float)((ulong)uVar5 >> 0x20);
      uVar5 = *(undefined8 *)(lVar20 + 0x28 + lVar18);
      auVar33._4_4_ = (int)uVar5;
      auVar33._0_4_ = *(undefined4 *)(lVar20 + 0x24 + lVar18);
      auVar33._8_4_ = (int)((ulong)uVar5 >> 0x20);
    }
    in_XMM12_Dd = 0.0;
    fVar41 = 0.0;
    fStack_1ac = 0.0;
    _local_1b8 = auVar33;
    fVar71 = 0.0;
  }
  else if (iVar7 == 0xb001) {
    lVar20 = *plVar9;
    lVar18 = plVar9[2] * uVar19;
    uVar5 = *(undefined8 *)(lVar20 + 0x10 + lVar18);
    fVar63 = (float)uVar5;
    fVar84 = (float)((ulong)uVar5 >> 0x20);
    uVar5 = *(undefined8 *)(lVar20 + 0x34 + lVar18);
    fVar57 = *(float *)(lVar20 + lVar18);
    in_XMM12_Db = *(float *)(lVar20 + 4 + lVar18);
    fVar39 = *(float *)(lVar20 + 8 + lVar18);
    in_XMM12_Da = *(float *)(lVar20 + 0xc + lVar18);
    fVar45 = *(float *)(lVar20 + 0x18 + lVar18);
    uVar6 = *(undefined8 *)(lVar20 + 0x1c + lVar18);
    fVar52 = (float)uVar6;
    fVar53 = (float)((ulong)uVar6 >> 0x20);
    fVar69 = *(float *)(lVar20 + 0x24 + lVar18);
    fVar41 = *(float *)(lVar20 + 0x28 + lVar18);
    in_XMM12_Dd = *(float *)(lVar20 + 0x2c + lVar18);
    fVar61 = *(float *)(lVar20 + 0x30 + lVar18);
    fVar83 = fVar61 * fVar61 + in_XMM12_Dd * in_XMM12_Dd + fVar69 * fVar69 + fVar41 * fVar41;
    auVar27 = rsqrtss(ZEXT416((uint)fVar83),ZEXT416((uint)fVar83));
    fVar82 = auVar27._0_4_;
    fVar71 = fVar82 * fVar82 * fVar83 * -0.5 * fVar82 + fVar82 * 1.5;
    fVar69 = fVar69 * fVar71;
    fVar41 = fVar41 * fVar71;
    in_XMM12_Dd = in_XMM12_Dd * fVar71;
    fVar71 = fVar71 * fVar61;
    fVar82 = (float)uVar5;
    fVar83 = (float)((ulong)uVar5 >> 0x20);
    in_XMM12_Dc = *(float *)(lVar20 + 0x3c + lVar18);
    fVar54 = 0.0;
    fVar70 = 0.0;
    local_1b8._4_4_ = fVar52;
    local_1b8._0_4_ = fVar45;
    fStack_1b0 = fVar53;
    fStack_1ac = fVar69;
    fVar46 = fVar69;
    fVar56 = fVar53;
  }
  else if (iVar7 == 0x9244) {
    lVar20 = *plVar9;
    lVar18 = plVar9[2] * uVar19;
    pfVar1 = (float *)(lVar20 + lVar18);
    fVar57 = *pfVar1;
    fVar82 = pfVar1[1];
    fVar83 = pfVar1[2];
    fVar41 = pfVar1[3];
    pfVar1 = (float *)(lVar20 + 0x10 + lVar18);
    in_XMM12_Da = *pfVar1;
    in_XMM12_Db = pfVar1[1];
    in_XMM12_Dc = pfVar1[2];
    in_XMM12_Dd = pfVar1[3];
    pfVar1 = (float *)(lVar20 + 0x20 + lVar18);
    fVar63 = *pfVar1;
    fVar84 = pfVar1[1];
    fVar39 = pfVar1[2];
    fVar71 = pfVar1[3];
    _local_1b8 = *(undefined1 (*) [16])(lVar20 + 0x30 + lVar18);
  }
LAB_00a078ec:
  lVar20 = (ulong)(uVar16 + 1) * 0x38;
  plVar9 = (long *)(lVar10 + lVar20);
  iVar7 = *(int *)(lVar10 + 0x20 + lVar20);
  if (iVar7 < 0x9244) {
    if (iVar7 == 0x9134) {
      lVar10 = *plVar9;
      lVar20 = uVar19 * plVar9[2];
      auVar87._4_4_ = *(undefined4 *)(lVar10 + 0x10 + lVar20);
      auVar87._0_4_ = *(undefined4 *)(lVar10 + lVar20);
      fVar40 = *(float *)(lVar10 + 4 + lVar20);
      fVar45 = *(float *)(lVar10 + 8 + lVar20);
      fVar46 = *(float *)(lVar10 + 0xc + lVar20);
      auVar87._8_4_ = *(undefined4 *)(lVar10 + 0x20 + lVar20);
      auVar87._12_4_ = 0;
      fVar47 = *(float *)(lVar10 + 0x14 + lVar20);
      fVar51 = *(float *)(lVar10 + 0x24 + lVar20);
      fVar68 = 0.0;
      fVar52 = *(float *)(lVar10 + 0x18 + lVar20);
      fVar53 = *(float *)(lVar10 + 0x28 + lVar20);
      fVar69 = 0.0;
      fVar54 = *(float *)(lVar10 + 0x1c + lVar20);
      fVar56 = *(float *)(lVar10 + 0x2c + lVar20);
      fVar70 = 0.0;
    }
    else if (iVar7 == 0x9234) {
      lVar10 = *plVar9;
      lVar20 = uVar19 * plVar9[2];
      uVar5 = *(undefined8 *)(lVar10 + 4 + lVar20);
      auVar87._4_4_ = (int)uVar5;
      auVar87._0_4_ = *(undefined4 *)(lVar10 + lVar20);
      auVar87._8_4_ = (int)((ulong)uVar5 >> 0x20);
      auVar87._12_4_ = 0;
      uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar20);
      fVar40 = *(float *)(lVar10 + 0xc + lVar20);
      fVar47 = (float)uVar5;
      fVar51 = (float)((ulong)uVar5 >> 0x20);
      fVar68 = 0.0;
      uVar5 = *(undefined8 *)(lVar10 + 0x1c + lVar20);
      fVar45 = *(float *)(lVar10 + 0x18 + lVar20);
      fVar52 = (float)uVar5;
      fVar53 = (float)((ulong)uVar5 >> 0x20);
      fVar69 = 0.0;
      uVar5 = *(undefined8 *)(lVar10 + 0x28 + lVar20);
      fVar46 = *(float *)(lVar10 + 0x24 + lVar20);
      fVar54 = (float)uVar5;
      fVar56 = (float)((ulong)uVar5 >> 0x20);
      fVar70 = 0.0;
    }
  }
  else if (iVar7 == 0xb001) {
    lVar10 = *plVar9;
    lVar20 = uVar19 * plVar9[2];
    uVar5 = *(undefined8 *)(lVar10 + 0x10 + lVar20);
    fVar45 = (float)uVar5;
    fVar52 = (float)((ulong)uVar5 >> 0x20);
    uVar5 = *(undefined8 *)(lVar10 + 0x34 + lVar20);
    fVar47 = *(float *)(lVar10 + 4 + lVar20);
    fVar53 = *(float *)(lVar10 + 8 + lVar20);
    fVar40 = *(float *)(lVar10 + 0xc + lVar20);
    fVar46 = *(float *)(lVar10 + 0x18 + lVar20);
    uVar6 = *(undefined8 *)(lVar10 + 0x1c + lVar20);
    fVar70 = *(float *)(lVar10 + 0x24 + lVar20);
    fVar61 = *(float *)(lVar10 + 0x28 + lVar20);
    fVar68 = *(float *)(lVar10 + 0x2c + lVar20);
    fVar69 = *(float *)(lVar10 + 0x30 + lVar20);
    fVar54 = fVar69 * fVar69 + fVar68 * fVar68 + fVar70 * fVar70 + fVar61 * fVar61;
    auVar27 = rsqrtss(ZEXT416((uint)fVar54),ZEXT416((uint)fVar54));
    fVar51 = auVar27._0_4_;
    fVar51 = fVar51 * fVar51 * fVar54 * -0.5 * fVar51 + fVar51 * 1.5;
    fVar70 = fVar70 * fVar51;
    fVar68 = fVar68 * fVar51;
    fVar69 = fVar51 * fVar69;
    auVar87._4_4_ = (int)uVar5;
    auVar87._0_4_ = *(undefined4 *)(lVar10 + lVar20);
    auVar87._8_4_ = (int)((ulong)uVar5 >> 0x20);
    auVar87._12_4_ = fVar61 * fVar51;
    fVar51 = *(float *)(lVar10 + 0x3c + lVar20);
    fVar56 = (float)((ulong)uVar6 >> 0x20);
    fVar54 = (float)uVar6;
  }
  else if (iVar7 == 0x9244) {
    lVar10 = *plVar9;
    lVar20 = uVar19 * plVar9[2];
    auVar87 = *(undefined1 (*) [16])(lVar10 + lVar20);
    pfVar1 = (float *)(lVar10 + 0x10 + lVar20);
    fVar40 = *pfVar1;
    fVar47 = pfVar1[1];
    fVar51 = pfVar1[2];
    fVar68 = pfVar1[3];
    pfVar1 = (float *)(lVar10 + 0x20 + lVar20);
    fVar45 = *pfVar1;
    fVar52 = pfVar1[1];
    fVar53 = pfVar1[2];
    fVar69 = pfVar1[3];
    pfVar1 = (float *)(lVar10 + 0x30 + lVar20);
    fVar46 = *pfVar1;
    fVar54 = pfVar1[1];
    fVar56 = pfVar1[2];
    fVar70 = pfVar1[3];
  }
  fVar75 = auVar87._12_4_;
  fVar74 = fVar71 * fVar69 + in_XMM12_Dd * fVar68 + fVar70 * fStack_1ac + fVar41 * fVar75;
  fVar61 = -fVar74;
  if (fVar74 < fVar61) {
    fVar68 = -fVar68;
  }
  uVar16 = (uint)-fVar69 & -(uint)(fVar74 < fVar61);
  fVar48 = ABS(fVar74);
  fVar55 = fVar61;
  if (fVar61 <= fVar74) {
    fVar55 = fVar74;
  }
  fVar22 = 1.0 - fVar48;
  if (fVar22 < 0.0) {
    local_b8 = fVar48;
    fStack_b4 = ABS(fVar71);
    fStack_b0 = ABS(fVar71);
    fStack_ac = ABS(fVar71);
    local_a8 = uVar16;
    uStack_a4 = (uint)-fVar69 & (uint)fVar71;
    uStack_a0 = (uint)-fVar69 & (uint)fVar71;
    uStack_9c = (uint)-fVar69 & (uint)fVar71;
    fVar22 = sqrtf(fVar22);
    uVar16 = local_a8;
    fVar23 = local_b8;
  }
  else {
    fVar22 = SQRT(fVar22);
    fVar23 = fVar48;
  }
  fVar69 = (float)(~-(uint)(fVar74 < fVar61) & (uint)fVar69 | uVar16);
  fVar48 = 1.5707964 -
           fVar22 * (((((fVar48 * -0.0043095737 + 0.0192803) * fVar48 + -0.04489909) * fVar48 +
                      0.08785567) * fVar48 + -0.21450998) * fVar48 + 1.5707952);
  fVar61 = 0.0;
  if (0.0 <= fVar48) {
    fVar61 = fVar48;
  }
  fVar61 = (float)(-(uint)(1.0 < fVar23) & 0x7fc00000 |
                  ~-(uint)(1.0 < fVar23) &
                  (uint)(1.5707964 -
                        (float)((uint)-fVar61 & -(uint)(fVar55 < 0.0) |
                               ~-(uint)(fVar55 < 0.0) & (uint)fVar61))) * fVar73;
  fVar22 = floorf(fVar61 * 0.63661975);
  fVar61 = fVar61 - fVar22 * 1.5707964;
  fVar48 = fVar61 * fVar61;
  uVar16 = (int)fVar22 & 3;
  fVar23 = ((((fVar48 * -2.5963018e-07 + 2.4756235e-05) * fVar48 + -0.001388833) * fVar48 +
            0.04166664) * fVar48 + -0.5) * fVar48 + 1.0;
  fVar61 = (((((fVar48 * -2.5029328e-08 + 2.7600126e-06) * fVar48 + -0.00019842605) * fVar48 +
             0.008333348) * fVar48 + -0.16666667) * fVar48 + 1.0) * fVar61;
  fVar48 = fVar23;
  if (((int)fVar22 & 1U) != 0) {
    fVar48 = fVar61;
    fVar61 = fVar23;
  }
  if (uVar16 - 1 < 2) {
    fVar48 = -fVar48;
  }
  fVar22 = fVar55 * in_XMM12_Dd - fVar68;
  fVar23 = fVar55 * fVar71 - fVar69;
  if (uVar16 < 2) {
    fVar61 = -fVar61;
  }
  fVar24 = 1.0 - fVar73;
  fVar29 = fVar24 * in_XMM12_Dd + fVar68 * fVar73;
  fVar68 = fVar24 * fVar71 + fVar69 * fVar73;
  uVar16 = (int)((uint)(fVar74 < 0.0) << 0x1f) >> 0x1f;
  uVar62 = (int)((uint)(fVar74 < 0.0) << 0x1f) >> 0x1f;
  fVar72 = (float)((uint)-fVar70 & uVar16 | ~uVar16 & (uint)fVar70);
  fVar75 = (float)((uint)-fVar75 & uVar62 | ~uVar62 & (uint)fVar75);
  fVar70 = fVar55 * fStack_1ac - fVar72;
  fVar69 = fVar55 * fVar41 - fVar75;
  auVar80._0_8_ = CONCAT44(fVar71,fVar23) ^ 0x8000000000000000;
  auVar80._8_4_ = -fVar71;
  auVar80._12_4_ = -fVar71;
  auVar81._4_12_ = auVar80._4_12_;
  auVar81._0_4_ = fVar23 * fVar23 + fVar22 * fVar22 + fVar70 * fVar70 + fVar69 * fVar69;
  auVar67._0_8_ = CONCAT44(fVar71,auVar81._0_4_) ^ 0x8000000000000000;
  auVar67._8_4_ = -fVar71;
  auVar67._12_4_ = -fVar71;
  auVar27 = rsqrtss(auVar67,auVar81);
  fVar74 = auVar27._0_4_;
  fVar64 = fVar74 * fVar74 * auVar81._0_4_ * -0.5 * fVar74 + fVar74 * 1.5;
  fVar74 = fStack_1ac * fVar24 + fVar72 * fVar73;
  fVar75 = fVar41 * fVar24 + fVar75 * fVar73;
  fVar85 = fVar68 * fVar68 + fVar29 * fVar29 + fVar74 * fVar74 + fVar75 * fVar75;
  auVar27 = rsqrtss(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85));
  fVar72 = auVar27._0_4_;
  fVar72 = fVar72 * fVar72 * fVar85 * -0.5 * fVar72 + fVar72 * 1.5;
  uVar16 = (int)((uint)(0.9995 < fVar55) << 0x1f) >> 0x1f;
  uVar62 = (int)((uint)(0.9995 < fVar55) << 0x1f) >> 0x1f;
  fVar70 = (float)(~uVar16 & (uint)(fVar48 * fStack_1ac + fVar61 * fVar64 * fVar70) |
                  (uint)(fVar72 * fVar74) & uVar16);
  fVar41 = (float)(~uVar62 & (uint)(fVar48 * fVar41 + fVar61 * fVar64 * fVar69) |
                  (uint)(fVar72 * fVar75) & uVar62);
  if (0.9995 < fVar55) {
    fVar29 = fVar29 * fVar72;
    fVar68 = fVar68 * fVar72;
  }
  else {
    fVar29 = in_XMM12_Dd * fVar48 + fVar22 * fVar64 * fVar61;
    fVar68 = fVar71 * fVar48 + fVar23 * fVar64 * fVar61;
  }
  local_108 = auVar87._0_4_;
  fStack_104 = auVar87._4_4_;
  fStack_100 = auVar87._8_4_;
  fVar71 = fVar57 * fVar24 + local_108 * fVar73;
  fVar69 = in_XMM12_Dc * fVar24;
  fVar40 = in_XMM12_Da * fVar24 + fVar40 * fVar73;
  fVar47 = in_XMM12_Db * fVar24 + fVar47 * fVar73;
  fVar74 = fVar63 * fVar24 + fVar45 * fVar73;
  fVar75 = fVar84 * fVar24 + fVar52 * fVar73;
  fVar55 = fVar39 * fVar24 + fVar53 * fVar73;
  fVar63 = (float)local_1b8._0_4_ * fVar24 + fVar46 * fVar73;
  fVar84 = (float)local_1b8._4_4_ * fVar24 + fVar54 * fVar73;
  fVar39 = fStack_1b0 * fVar24 + fVar56 * fVar73;
  fVar53 = fVar41 * fVar29 + fVar70 * fVar68;
  fVar52 = fVar41 * fVar29 - fVar70 * fVar68;
  fVar45 = fVar70 * fVar70 + fVar41 * fVar41 + -fVar29 * fVar29 + -fVar68 * fVar68;
  fVar57 = fVar70 * fVar70 - fVar41 * fVar41;
  fVar48 = fVar29 * fVar29 + fVar57 + -fVar68 * fVar68;
  fVar54 = fVar41 * fVar68 - fVar70 * fVar29;
  fVar56 = fVar70 * fVar29 + fVar41 * fVar68;
  fVar22 = fVar29 * fVar68 + fVar70 * fVar41;
  fVar61 = fVar29 * fVar68 - fVar70 * fVar41;
  fVar53 = fVar53 + fVar53;
  fVar54 = fVar54 + fVar54;
  fVar57 = fVar68 * fVar68 + fVar57 + -fVar29 * fVar29;
  fVar41 = fVar45 * 1.0 + fVar53 * 0.0 + fVar54 * 0.0;
  fVar46 = fVar45 * 0.0 + fVar53 * 1.0 + fVar54 * 0.0;
  fVar45 = fVar45 * 0.0 + fVar53 * 0.0 + fVar54 * 1.0;
  fVar22 = fVar22 + fVar22;
  fVar52 = fVar52 + fVar52;
  fVar53 = fVar52 * 1.0 + fVar48 * 0.0 + fVar22 * 0.0;
  fVar54 = fVar52 * 0.0 + fVar48 * 1.0 + fVar22 * 0.0;
  fVar52 = fVar52 * 0.0 + fVar48 * 0.0 + fVar22 * 1.0;
  fVar56 = fVar56 + fVar56;
  fVar61 = fVar61 + fVar61;
  fVar70 = fVar56 * 1.0 + fVar61 * 0.0 + fVar57 * 0.0;
  fVar68 = fVar56 * 0.0 + fVar61 * 1.0 + fVar57 * 0.0;
  fVar57 = fVar56 * 0.0 + fVar61 * 0.0 + fVar57 * 1.0;
  in_XMM12_Da = fVar71 * fVar41 + fVar53 * 0.0 + fVar70 * 0.0;
  in_XMM12_Db = fVar71 * fVar46 + fVar54 * 0.0 + fVar68 * 0.0;
  in_XMM12_Dc = fVar71 * fVar45 + fVar52 * 0.0 + fVar57 * 0.0;
  a0.field_0._0_4_ = fVar40 * fVar41 + fVar47 * fVar53 + fVar70 * 0.0;
  a0.field_0._4_4_ = fVar40 * fVar46 + fVar47 * fVar54 + fVar68 * 0.0;
  a0.field_0._8_4_ = fVar40 * fVar45 + fVar47 * fVar52 + fVar57 * 0.0;
  auVar25._0_4_ = fVar74 * fVar41 + fVar75 * fVar53 + fVar55 * fVar70;
  auVar25._4_4_ = fVar74 * fVar46 + fVar75 * fVar54 + fVar55 * fVar68;
  auVar25._8_4_ = fVar74 * fVar45 + fVar75 * fVar52 + fVar55 * fVar57;
  auVar49._0_4_ =
       fVar63 * fVar41 + fVar84 * fVar53 + fVar39 * fVar70 +
       fVar82 * fVar24 + fStack_104 * fVar73 + 0.0;
  auVar49._4_4_ =
       fVar63 * fVar46 + fVar84 * fVar54 + fVar39 * fVar68 +
       fVar83 * fVar24 + fStack_100 * fVar73 + 0.0;
  auVar49._8_4_ =
       fVar63 * fVar45 + fVar84 * fVar52 + fVar39 * fVar57 + fVar69 + fVar51 * fVar73 + 0.0;
LAB_00a06626:
  fVar57 = auVar25._0_4_;
  fVar61 = auVar25._4_4_;
  fVar63 = auVar25._8_4_;
  fVar82 = a0.field_0._0_4_;
  fVar83 = a0.field_0._4_4_;
  fVar84 = a0.field_0._8_4_;
  auVar36._0_4_ = fVar82 * fVar61 - fVar57 * fVar83;
  fVar39 = fVar83 * fVar63 - fVar61 * fVar84;
  fVar41 = fVar84 * fVar57 - fVar63 * fVar82;
  auVar26._4_4_ = fVar61 * in_XMM12_Dc - fVar63 * in_XMM12_Db;
  auVar36._4_4_ = fVar57 * in_XMM12_Db - fVar61 * in_XMM12_Da;
  auVar36._8_4_ = fVar83 * in_XMM12_Da - in_XMM12_Db * fVar82;
  auVar36._12_4_ = 0;
  auVar26._0_4_ = fVar39;
  auVar26._8_4_ = fVar84 * in_XMM12_Db - in_XMM12_Dc * fVar83;
  auVar26._12_4_ = 0;
  auVar43._4_4_ = fVar63 * in_XMM12_Da - fVar57 * in_XMM12_Dc;
  auVar43._0_4_ = fVar41;
  auVar43._8_4_ = fVar82 * in_XMM12_Dc - in_XMM12_Da * fVar84;
  auVar43._12_4_ = 0;
  auVar86._0_4_ = in_XMM12_Dc * auVar36._0_4_ + in_XMM12_Db * fVar41 + in_XMM12_Da * fVar39;
  auVar86._4_4_ = auVar86._0_4_;
  auVar86._8_4_ = auVar86._0_4_;
  auVar86._12_4_ = auVar86._0_4_;
  auVar27 = divps(auVar26,auVar86);
  auVar44 = divps(auVar43,auVar86);
  auVar37 = divps(auVar36,auVar86);
  fVar51 = auVar49._0_4_;
  fVar52 = auVar49._4_4_;
  fVar53 = auVar49._8_4_;
  fVar82 = auVar37._0_4_;
  fVar83 = auVar37._4_4_;
  fVar84 = auVar37._8_4_;
  fVar39 = auVar44._0_4_;
  fVar41 = auVar44._4_4_;
  fVar40 = auVar44._8_4_;
  fVar57 = auVar27._0_4_;
  fVar61 = auVar27._4_4_;
  fVar63 = auVar27._8_4_;
  fVar45 = fVar51 * fVar57 + fVar52 * fVar39 + fVar53 * fVar82;
  fVar46 = fVar51 * fVar61 + fVar52 * fVar41 + fVar53 * fVar83;
  fVar47 = fVar51 * fVar63 + fVar52 * fVar40 + fVar53 * fVar84;
  local_80 = 2;
  bVar14 = true;
  local_68 = 0.0;
  if ((((context->query_type == POINT_QUERY_TYPE_SPHERE) &&
       (ABS(fVar63 * fVar40 + fVar61 * fVar41 + fVar57 * fVar39) <= 1e-05)) &&
      (ABS(fVar63 * fVar84 + fVar61 * fVar83 + fVar57 * fVar82) <= 1e-05)) &&
     (ABS(fVar40 * fVar84 + fVar41 * fVar83 + fVar39 * fVar82) <= 1e-05)) {
    fVar54 = fVar63 * fVar63 + fVar61 * fVar61 + fVar57 * fVar57;
    fVar56 = fVar40 * fVar40 + fVar41 * fVar41 + fVar39 * fVar39;
    if (((ABS(fVar54 - fVar56) <= 1e-05) &&
        (fVar70 = fVar84 * fVar84 + fVar83 * fVar83 + fVar82 * fVar82, ABS(fVar54 - fVar70) <= 1e-05
        )) && (ABS(fVar56 - fVar70) <= 1e-05)) {
      local_68 = SQRT(fVar54);
      local_80 = 1;
      bVar14 = false;
    }
  }
  pRVar11 = context->userContext;
  uVar16 = pRVar11->instStackSize;
  *(ulong *)(pRVar11->instID + uVar16) = CONCAT44((*prim).primID_,(*prim).instID_);
  *(undefined1 (*) [16])pRVar11->world2inst[uVar16] = auVar27;
  *(undefined1 (*) [16])(pRVar11->world2inst[uVar16] + 4) = auVar44;
  *(undefined1 (*) [16])(pRVar11->world2inst[uVar16] + 8) = auVar37;
  pfVar1 = pRVar11->world2inst[uVar16] + 0xc;
  *pfVar1 = -fVar45;
  pfVar1[1] = -fVar46;
  pfVar1[2] = -fVar47;
  pfVar1[3] = -(fVar51 * auVar27._12_4_ + fVar52 * auVar44._12_4_ + fVar53 * auVar37._12_4_);
  pafVar2 = pRVar11->inst2world + uVar16;
  (*pafVar2)[0] = in_XMM11_Da;
  (*pafVar2)[1] = in_XMM11_Db;
  (*pafVar2)[2] = in_XMM11_Dc;
  (*pafVar2)[3] = in_XMM11_Dd;
  *(undefined1 (*) [16])(pRVar11->inst2world[uVar16] + 4) = in_XMM14;
  pfVar1 = pRVar11->inst2world[uVar16] + 8;
  *pfVar1 = in_XMM13_Da;
  pfVar1[1] = in_XMM13_Db;
  pfVar1[2] = in_XMM13_Dc;
  pfVar1[3] = in_XMM13_Dd;
  pfVar1 = pRVar11->inst2world[uVar16] + 0xc;
  *pfVar1 = in_XMM15_Da;
  pfVar1[1] = in_XMM15_Db;
  pfVar1[2] = in_XMM15_Dc;
  pfVar1[3] = in_XMM15_Dd;
  pRVar11->instStackSize = pRVar11->instStackSize + 1;
  local_cc = query->time;
  fVar51 = (query->p).field_0.field_0.x;
  fVar52 = (query->p).field_0.field_0.y;
  fVar53 = (query->p).field_0.field_0.z;
  local_d8 = CONCAT44(fVar51 * fVar61 + fVar52 * fVar41 + (fVar53 * fVar83 - fVar46),
                      fVar51 * fVar57 + fVar52 * fVar39 + (fVar53 * fVar82 - fVar45));
  local_d0 = fVar51 * fVar63 + fVar52 * fVar40 + (fVar53 * fVar84 - fVar47);
  local_c8 = query->radius * local_68;
  local_88 = context->query_ws;
  local_78 = context->func;
  local_70 = context->userContext;
  local_60 = context->userPtr;
  local_90 = 0;
  local_58 = 0xffffffffffffffff;
  local_48 = local_88->radius;
  if (bVar14) {
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
    if ((local_48 < INFINITY) && (local_70->instStackSize != 0)) {
      uVar16 = local_70->instStackSize - 1;
      pafVar2 = local_70->world2inst + uVar16;
      pfVar1 = local_70->world2inst[uVar16] + 4;
      pfVar3 = local_70->world2inst[uVar16] + 8;
      pfVar4 = local_70->world2inst[uVar16] + 0xc;
      fVar41 = *pfVar4 - *pfVar3 * local_48;
      fVar40 = pfVar4[1] - pfVar3[1] * local_48;
      fVar45 = pfVar4[2] - pfVar3[2] * local_48;
      fVar46 = pfVar4[3] - pfVar3[3] * local_48;
      fVar47 = -local_48 * *pfVar1;
      fVar51 = -local_48 * pfVar1[1];
      fVar52 = -local_48 * pfVar1[2];
      fVar53 = -local_48 * pfVar1[3];
      fVar56 = fVar47 + fVar41;
      fVar70 = fVar51 + fVar40;
      fVar68 = fVar52 + fVar45;
      fVar69 = fVar53 + fVar46;
      fVar57 = -local_48 * (*pafVar2)[0];
      fVar61 = -local_48 * (*pafVar2)[1];
      fVar63 = -local_48 * (*pafVar2)[2];
      fVar54 = -local_48 * (*pafVar2)[3];
      fVar82 = fVar57 + fVar56;
      fVar83 = fVar61 + fVar70;
      fVar84 = fVar63 + fVar68;
      fVar39 = fVar54 + fVar69;
      auVar12._4_4_ = fVar83;
      auVar12._0_4_ = fVar82;
      auVar12._8_4_ = fVar84;
      auVar12._12_4_ = fVar39;
      auVar27 = minps(_DAT_01f7a9f0,auVar12);
      auVar13._4_4_ = fVar83;
      auVar13._0_4_ = fVar82;
      auVar13._8_4_ = fVar84;
      auVar13._12_4_ = fVar39;
      auVar37 = maxps(_DAT_01f7aa00,auVar13);
      fVar71 = *pfVar3 * local_48 + *pfVar4;
      fVar73 = pfVar3[1] * local_48 + pfVar4[1];
      fVar74 = pfVar3[2] * local_48 + pfVar4[2];
      fVar75 = pfVar3[3] * local_48 + pfVar4[3];
      fVar47 = fVar47 + fVar71;
      fVar51 = fVar51 + fVar73;
      fVar52 = fVar52 + fVar74;
      fVar53 = fVar53 + fVar75;
      auVar76._0_4_ = fVar57 + fVar47;
      auVar76._4_4_ = fVar61 + fVar51;
      auVar76._8_4_ = fVar63 + fVar52;
      auVar76._12_4_ = fVar54 + fVar53;
      auVar27 = minps(auVar27,auVar76);
      auVar37 = maxps(auVar37,auVar76);
      fVar82 = *pfVar1 * local_48;
      fVar83 = pfVar1[1] * local_48;
      fVar84 = pfVar1[2] * local_48;
      fVar39 = pfVar1[3] * local_48;
      fVar41 = fVar41 + fVar82;
      fVar40 = fVar40 + fVar83;
      fVar45 = fVar45 + fVar84;
      fVar46 = fVar46 + fVar39;
      auVar77._0_4_ = fVar57 + fVar41;
      auVar77._4_4_ = fVar61 + fVar40;
      auVar77._8_4_ = fVar63 + fVar45;
      auVar77._12_4_ = fVar54 + fVar46;
      auVar27 = minps(auVar27,auVar77);
      auVar37 = maxps(auVar37,auVar77);
      fVar82 = fVar82 + fVar71;
      fVar83 = fVar83 + fVar73;
      fVar84 = fVar84 + fVar74;
      fVar39 = fVar39 + fVar75;
      auVar60._0_4_ = fVar57 + fVar82;
      auVar60._4_4_ = fVar61 + fVar83;
      auVar60._8_4_ = fVar63 + fVar84;
      auVar60._12_4_ = fVar54 + fVar39;
      auVar27 = minps(auVar27,auVar60);
      auVar37 = maxps(auVar37,auVar60);
      fVar57 = local_48 * (*pafVar2)[0];
      fVar61 = local_48 * (*pafVar2)[1];
      fVar63 = local_48 * (*pafVar2)[2];
      local_48 = local_48 * (*pafVar2)[3];
      auVar65._0_4_ = fVar56 + fVar57;
      auVar65._4_4_ = fVar70 + fVar61;
      auVar65._8_4_ = fVar68 + fVar63;
      auVar65._12_4_ = fVar69 + local_48;
      auVar27 = minps(auVar27,auVar65);
      auVar37 = maxps(auVar37,auVar65);
      auVar50._0_4_ = fVar47 + fVar57;
      auVar50._4_4_ = fVar51 + fVar61;
      auVar50._8_4_ = fVar52 + fVar63;
      auVar50._12_4_ = fVar53 + local_48;
      auVar27 = minps(auVar27,auVar50);
      auVar37 = maxps(auVar37,auVar50);
      auVar38._0_4_ = fVar41 + fVar57;
      auVar38._4_4_ = fVar40 + fVar61;
      auVar38._8_4_ = fVar45 + fVar63;
      auVar38._12_4_ = fVar46 + local_48;
      auVar27 = minps(auVar27,auVar38);
      auVar37 = maxps(auVar37,auVar38);
      auVar28._0_4_ = fVar57 + fVar82;
      auVar28._4_4_ = fVar61 + fVar83;
      auVar28._8_4_ = fVar63 + fVar84;
      auVar28._12_4_ = local_48 + fVar39;
      auVar27 = minps(auVar27,auVar28);
      auVar37 = maxps(auVar37,auVar28);
      local_48 = (auVar37._0_4_ - auVar27._0_4_) * 0.5;
      fStack_44 = (auVar37._4_4_ - auVar27._4_4_) * 0.5;
      fStack_40 = (auVar37._8_4_ - auVar27._8_4_) * 0.5;
      fStack_3c = (auVar37._12_4_ - auVar27._12_4_) * 0.5;
    }
  }
  else {
    local_48 = local_68 * local_48;
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
  }
  local_98 = p_Var21;
  uVar15 = (**(code **)(p_Var21 + 0x88))(p_Var21 + 0x58,&local_d8);
  pRVar11 = context->userContext;
  uVar16 = pRVar11->instStackSize - 1;
  pRVar11->instStackSize = uVar16;
  pRVar11->instID[uVar16] = 0xffffffff;
  pRVar11->instPrimID[pRVar11->instStackSize] = 0xffffffff;
  return (bool)uVar15;
}

Assistant:

bool InstanceArrayIntersector1MB::pointQuery(PointQuery* query, PointQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      const AffineSpace3fa local2world = instance->getLocal2World(prim.primID_, query->time);
      const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, query->time);
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, prim.primID_, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func, 
          context->userContext,
          similarityScale,
          context->userPtr); 

        bool changed = object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }